

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::SELU_x86_avx512::forward_inplace(SELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [24];
  undefined1 auVar69 [40];
  undefined1 auVar70 [48];
  undefined1 auVar71 [56];
  undefined1 auVar72 [24];
  long *in_RSI;
  long in_RDI;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  float fVar78;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float alphaxlambda;
  __m128 _blob_2;
  __m128 _neg_2;
  __m128 _pos_2;
  __m128 _p_2;
  __m128 _lambda128;
  __m128 _alpha128;
  __m128 _one128;
  __m128 _zero128;
  __m256 _blob_1;
  __m256 _neg_1;
  __m256 _pos_1;
  __m256 _p_1;
  __m256 _lambda256;
  __m256 _alpha256;
  __m256 _one256;
  __m256 _zero256;
  __m512 _blob;
  __m512 _neg;
  __m512 _pos;
  __m512 _p;
  __m512 _lambda512;
  __m512 _alpha512;
  __m512 _one512;
  __m512 _zero512;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 local_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  int local_26d0;
  undefined8 local_26c0;
  undefined8 local_26b8;
  undefined8 local_26b0;
  undefined4 local_26a8;
  long local_26a0;
  undefined4 local_2698;
  undefined4 local_2694;
  undefined4 local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined8 local_2680;
  undefined1 (*local_2678) [64];
  int local_266c;
  int local_2668;
  int local_2664;
  int local_2660;
  int local_265c;
  int local_2658;
  int local_2654;
  long *local_2648;
  undefined1 local_2635;
  int local_2634;
  undefined8 *local_2628;
  undefined8 *local_2620;
  undefined8 *local_2610;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [64];
  uint local_2544;
  undefined1 local_2540 [64];
  uint local_24c4;
  undefined1 local_24c0 [64];
  undefined4 local_244c;
  undefined1 (*local_2448) [64];
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [64];
  undefined1 local_2300 [8];
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  ushort local_2282;
  float local_2280 [2];
  float afStack_2278 [2];
  float afStack_2270 [2];
  float afStack_2268 [2];
  float afStack_2260 [2];
  float afStack_2258 [2];
  float afStack_2250 [2];
  float afStack_2248 [2];
  undefined1 local_2240 [64];
  undefined1 local_2200 [16];
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  float local_2100 [2];
  float afStack_20f8 [2];
  float afStack_20f0 [2];
  float afStack_20e8 [2];
  float afStack_20e0 [2];
  float afStack_20d8 [2];
  float afStack_20d0 [2];
  float afStack_20c8 [2];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  float local_2080 [2];
  float afStack_2078 [2];
  float afStack_2070 [2];
  float afStack_2068 [2];
  float afStack_2060 [2];
  float afStack_2058 [2];
  float afStack_2050 [2];
  float afStack_2048 [2];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [64];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  float local_1d80 [2];
  float afStack_1d78 [2];
  float afStack_1d70 [2];
  float afStack_1d68 [2];
  float afStack_1d60 [2];
  float afStack_1d58 [2];
  float afStack_1d50 [2];
  float afStack_1d48 [2];
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 (*local_1c08) [64];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  uint local_1bd4;
  uint local_1bd0;
  undefined4 local_1bcc;
  undefined1 (*local_1bc8) [64];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined1 local_1b20 [8];
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 local_1b00 [32];
  undefined4 local_1ae0;
  undefined4 uStack_1adc;
  undefined4 uStack_1ad8;
  undefined4 uStack_1ad4;
  undefined4 uStack_1ad0;
  undefined4 uStack_1acc;
  undefined4 uStack_1ac8;
  undefined4 uStack_1ac4;
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [8];
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined1 local_1a60 [32];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined4 local_1a20;
  undefined4 uStack_1a1c;
  undefined4 uStack_1a18;
  undefined4 uStack_1a14;
  undefined4 uStack_1a10;
  undefined4 uStack_1a0c;
  undefined4 uStack_1a08;
  undefined4 uStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined4 local_19e0;
  undefined4 uStack_19dc;
  undefined4 uStack_19d8;
  undefined4 uStack_19d4;
  undefined4 uStack_19d0;
  undefined4 uStack_19cc;
  undefined4 uStack_19c8;
  undefined4 uStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 (*local_1778) [64];
  undefined1 local_1770 [16];
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float local_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float local_1724;
  undefined4 local_1720;
  undefined4 uStack_171c;
  undefined4 uStack_1718;
  undefined4 uStack_1714;
  undefined4 local_170c;
  undefined1 (*local_1708) [64];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined1 local_16b0 [8];
  undefined8 uStack_16a8;
  undefined1 local_16a0 [16];
  undefined4 local_1690;
  undefined4 uStack_168c;
  undefined4 uStack_1688;
  undefined4 uStack_1684;
  undefined1 local_1680 [16];
  undefined1 local_1670 [8];
  undefined8 uStack_1668;
  undefined1 local_1660 [8];
  undefined8 uStack_1658;
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined4 local_1630;
  undefined4 uStack_162c;
  undefined4 uStack_1628;
  undefined4 uStack_1624;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined4 local_1610;
  undefined4 uStack_160c;
  undefined4 uStack_1608;
  undefined4 uStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined4 local_1570;
  undefined4 uStack_156c;
  undefined4 uStack_1568;
  undefined4 uStack_1564;
  undefined8 local_1560;
  undefined8 uStack_1558;
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined4 local_14f0;
  undefined4 uStack_14ec;
  undefined4 uStack_14e8;
  undefined4 uStack_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined1 (*local_1498) [64];
  long local_1490;
  undefined4 local_1484;
  long local_1480;
  undefined1 (*local_1478) [64];
  undefined4 local_146c;
  int local_1468;
  int local_1464;
  undefined8 *local_1460;
  undefined4 local_1454;
  long local_1450;
  undefined8 *local_1430;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  float afStack_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280 [2];
  float afStack_1278 [2];
  float afStack_1270 [2];
  float afStack_1268 [2];
  float afStack_1260 [2];
  float afStack_1258 [2];
  float afStack_1250 [2];
  float afStack_1248 [2];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0 [2];
  float afStack_11b8 [2];
  float afStack_11b0 [2];
  float afStack_11a8 [2];
  float afStack_11a0 [2];
  float afStack_1198 [2];
  float afStack_1190 [2];
  float afStack_1188 [2];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100 [2];
  float afStack_10f8 [2];
  float afStack_10f0 [2];
  float afStack_10e8 [2];
  float afStack_10e0 [2];
  float afStack_10d8 [2];
  float afStack_10d0 [2];
  float afStack_10c8 [2];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040 [2];
  float afStack_1038 [2];
  float afStack_1030 [2];
  float afStack_1028 [2];
  float afStack_1020 [2];
  float afStack_1018 [2];
  float afStack_1010 [2];
  float afStack_1008 [2];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0 [2];
  float afStack_fb8 [2];
  float afStack_fb0 [2];
  float afStack_fa8 [2];
  float afStack_fa0 [2];
  float afStack_f98 [2];
  float afStack_f90 [2];
  float afStack_f88 [2];
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  float afStack_f60 [2];
  float afStack_f58 [2];
  float afStack_f50 [2];
  float afStack_f48 [2];
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  float afStack_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0 [2];
  float afStack_eb8 [2];
  float afStack_eb0 [2];
  float afStack_ea8 [2];
  float afStack_ea0 [2];
  float afStack_e98 [2];
  float afStack_e90 [2];
  float afStack_e88 [2];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  ushort local_e02;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0 [2];
  float afStack_db8 [2];
  float afStack_db0 [2];
  float afStack_da8 [2];
  float afStack_da0 [2];
  float afStack_d98 [2];
  float afStack_d90 [2];
  float afStack_d88 [2];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00 [2];
  float afStack_cf8 [2];
  float afStack_cf0 [2];
  float afStack_ce8 [2];
  float afStack_ce0 [2];
  float afStack_cd8 [2];
  float afStack_cd0 [2];
  float afStack_cc8 [2];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40 [2];
  float afStack_c38 [2];
  float afStack_c30 [2];
  float afStack_c28 [2];
  float afStack_c20 [2];
  float afStack_c18 [2];
  float afStack_c10 [2];
  float afStack_c08 [2];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined4 local_ac4;
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  uint local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  uint local_984;
  undefined1 local_980 [32];
  uint local_948;
  uint local_944;
  uint local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  uint local_92c;
  undefined1 *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  float *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  float *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  float *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  float *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  float *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  float *local_898;
  float *local_890;
  undefined1 *local_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 *local_830;
  float *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  float *local_810;
  undefined1 *local_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740 [2];
  float afStack_738 [2];
  float afStack_730 [2];
  float afStack_728 [2];
  float local_720 [2];
  float afStack_718 [2];
  float afStack_710 [2];
  float afStack_708 [2];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0 [2];
  float afStack_6d8 [2];
  float afStack_6d0 [2];
  float afStack_6c8 [2];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  float local_680 [2];
  float afStack_678 [2];
  float afStack_670 [2];
  float afStack_668 [2];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620 [2];
  float afStack_618 [2];
  float afStack_610 [2];
  float afStack_608 [2];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0 [2];
  float afStack_5b8 [2];
  float afStack_5b0 [2];
  float afStack_5a8 [2];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560 [2];
  float afStack_558 [2];
  float afStack_550 [2];
  float afStack_548 [2];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float local_480 [2];
  float afStack_478 [2];
  float afStack_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420 [2];
  float afStack_418 [2];
  float afStack_410 [2];
  float afStack_408 [2];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined4 local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  float *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  float *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  float *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  float *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2654 = *(int *)((long)in_RSI + 0x2c);
  local_2658 = (int)in_RSI[6];
  local_265c = *(int *)((long)in_RSI + 0x34);
  local_2660 = (int)in_RSI[3];
  local_2664 = (int)in_RSI[7];
  local_2668 = local_2654 * local_2658 * local_265c * local_2660;
  local_2648 = in_RSI;
  for (local_266c = 0; local_266c < local_2664; local_266c = local_266c + 1) {
    local_2628 = &local_26c0;
    local_1464 = *(int *)((long)local_2648 + 0x2c);
    local_1468 = (int)local_2648[6];
    local_146c = *(undefined4 *)((long)local_2648 + 0x34);
    local_1478 = (undefined1 (*) [64])
                 (*local_2648 + local_2648[8] * (long)local_266c * local_2648[2]);
    local_1480 = local_2648[2];
    local_1484 = (undefined4)local_2648[3];
    local_1490 = local_2648[4];
    local_1460 = &local_26c0;
    local_1450 = (long)local_1464 * (long)local_1468 * local_1480;
    local_2620 = &local_26c0;
    local_2610 = &local_26c0;
    local_1454 = 0x10;
    local_2634 = local_266c;
    local_2635 = 1;
    local_26c0 = 0;
    local_26b0 = 0;
    local_26a8 = 0;
    local_2698 = 0;
    local_2694 = 0;
    local_2690 = 0;
    local_268c = 0;
    local_2688 = 0;
    local_2680 = 0;
    local_26b8 = 0;
    local_26d0 = 0;
    local_2600 = 0;
    uStack_25f8 = 0;
    uStack_25f0 = 0;
    uStack_25e8 = 0;
    uStack_25e0 = 0;
    uStack_25d8 = 0;
    uStack_25d0 = 0;
    uStack_25c8 = 0;
    local_244c = 0x3f800000;
    local_24c0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_24c4 = *(uint *)(in_RDI + 0xd0);
    local_2540 = vbroadcastss_avx512f(ZEXT416(local_24c4));
    local_2544 = *(uint *)(in_RDI + 0xd4);
    local_25c0 = vbroadcastss_avx512f(ZEXT416(local_2544));
    local_2678 = local_1478;
    for (; local_26d0 + 0xf < local_2668; local_26d0 = local_26d0 + 0x10) {
      local_2448 = local_2678;
      local_2440 = *(undefined8 *)*local_2678;
      uStack_2438 = *(undefined8 *)(*local_2678 + 8);
      uStack_2430 = *(undefined8 *)(*local_2678 + 0x10);
      uStack_2428 = *(undefined8 *)(*local_2678 + 0x18);
      uStack_2420 = *(undefined8 *)(*local_2678 + 0x20);
      uStack_2418 = *(undefined8 *)(*local_2678 + 0x28);
      uStack_2410 = *(undefined8 *)(*local_2678 + 0x30);
      uStack_2408 = *(undefined8 *)(*local_2678 + 0x38);
      local_2400 = 0;
      uStack_23f8 = 0;
      uStack_23f0 = 0;
      uStack_23e8 = 0;
      uStack_23e0 = 0;
      uStack_23d8 = 0;
      uStack_23d0 = 0;
      uStack_23c8 = 0;
      auVar73 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_2678);
      local_2380 = 0;
      uStack_2378 = 0;
      uStack_2370 = 0;
      uStack_2368 = 0;
      uStack_2360 = 0;
      uStack_2358 = 0;
      uStack_2350 = 0;
      uStack_2348 = 0;
      auVar74 = vminps_avx512f(ZEXT1664(ZEXT816(0)),*local_2678);
      local_28c0 = auVar74._0_8_;
      uStack_28b8 = auVar74._8_8_;
      uStack_28b0 = auVar74._16_8_;
      uStack_28a8 = auVar74._24_8_;
      uStack_28a0 = auVar74._32_8_;
      uStack_2898 = auVar74._40_8_;
      uStack_2890 = auVar74._48_8_;
      uStack_2888 = auVar74._56_8_;
      local_2140 = 0;
      uStack_2138 = 0;
      uStack_2130 = 0;
      uStack_2128 = 0;
      uStack_2120 = 0;
      uStack_2118 = 0;
      uStack_2110 = 0;
      uStack_2108 = 0;
      local_2280[0] = 1.0;
      local_2280[1] = 1.0;
      afStack_2278[0] = 1.0;
      afStack_2278[1] = 1.0;
      afStack_2270[0] = 1.0;
      afStack_2270[1] = 1.0;
      afStack_2268[0] = 1.0;
      afStack_2268[1] = 1.0;
      afStack_2260[0] = 1.0;
      afStack_2260[1] = 1.0;
      afStack_2258[0] = 1.0;
      afStack_2258[1] = 1.0;
      afStack_2250[0] = 1.0;
      afStack_2250[1] = 1.0;
      afStack_2248[0] = 1.0;
      afStack_2248[1] = 1.0;
      local_2040 = local_28c0;
      uStack_2038 = uStack_28b8;
      uStack_2030 = uStack_28b0;
      uStack_2028 = uStack_28a8;
      uStack_2020 = uStack_28a0;
      uStack_2018 = uStack_2898;
      uStack_2010 = uStack_2890;
      uStack_2008 = uStack_2888;
      local_2080[0] = 88.37626;
      local_2080[1] = 88.37626;
      afStack_2078[0] = 88.37626;
      afStack_2078[1] = 88.37626;
      afStack_2070[0] = 88.37626;
      afStack_2070[1] = 88.37626;
      afStack_2068[0] = 88.37626;
      afStack_2068[1] = 88.37626;
      afStack_2060[0] = 88.37626;
      afStack_2060[1] = 88.37626;
      afStack_2058[0] = 88.37626;
      afStack_2058[1] = 88.37626;
      afStack_2050[0] = 88.37626;
      afStack_2050[1] = 88.37626;
      afStack_2048[0] = 88.37626;
      afStack_2048[1] = 88.37626;
      auVar75._8_4_ = 88.37626;
      auVar75._12_4_ = 88.37626;
      auVar75._0_4_ = 88.37626;
      auVar75._4_4_ = 88.37626;
      auVar75._16_4_ = 88.37626;
      auVar75._20_4_ = 88.37626;
      auVar75._24_4_ = 88.37626;
      auVar75._28_4_ = 88.37626;
      auVar75._32_4_ = 88.37626;
      auVar75._36_4_ = 88.37626;
      auVar75._40_4_ = 88.37626;
      auVar75._44_4_ = 88.37626;
      auVar75._48_4_ = 88.37626;
      auVar75._52_4_ = 88.37626;
      auVar75._56_4_ = 88.37626;
      auVar75._60_4_ = 88.37626;
      auVar75 = vminps_avx512f(auVar74,auVar75);
      local_2180._0_8_ = auVar75._0_8_;
      local_20c0 = local_2180._0_8_;
      local_2180._8_8_ = auVar75._8_8_;
      uStack_20b8 = local_2180._8_8_;
      local_2180._16_8_ = auVar75._16_8_;
      uStack_20b0 = local_2180._16_8_;
      local_2180._24_8_ = auVar75._24_8_;
      uStack_20a8 = local_2180._24_8_;
      local_2180._32_8_ = auVar75._32_8_;
      uStack_20a0 = local_2180._32_8_;
      local_2180._40_8_ = auVar75._40_8_;
      uStack_2098 = local_2180._40_8_;
      local_2180._48_8_ = auVar75._48_8_;
      uStack_2090 = local_2180._48_8_;
      local_2180._56_8_ = auVar75._56_8_;
      uStack_2088 = local_2180._56_8_;
      local_2100[0] = -88.37626;
      local_2100[1] = -88.37626;
      afStack_20f8[0] = -88.37626;
      afStack_20f8[1] = -88.37626;
      afStack_20f0[0] = -88.37626;
      afStack_20f0[1] = -88.37626;
      afStack_20e8[0] = -88.37626;
      afStack_20e8[1] = -88.37626;
      afStack_20e0[0] = -88.37626;
      afStack_20e0[1] = -88.37626;
      afStack_20d8[0] = -88.37626;
      afStack_20d8[1] = -88.37626;
      afStack_20d0[0] = -88.37626;
      afStack_20d0[1] = -88.37626;
      afStack_20c8[0] = -88.37626;
      afStack_20c8[1] = -88.37626;
      auVar74._8_4_ = -88.37626;
      auVar74._12_4_ = -88.37626;
      auVar74._0_4_ = -88.37626;
      auVar74._4_4_ = -88.37626;
      auVar74._16_4_ = -88.37626;
      auVar74._20_4_ = -88.37626;
      auVar74._24_4_ = -88.37626;
      auVar74._28_4_ = -88.37626;
      auVar74._32_4_ = -88.37626;
      auVar74._36_4_ = -88.37626;
      auVar74._40_4_ = -88.37626;
      auVar74._44_4_ = -88.37626;
      auVar74._48_4_ = -88.37626;
      auVar74._52_4_ = -88.37626;
      auVar74._56_4_ = -88.37626;
      auVar74._60_4_ = -88.37626;
      auVar74 = vmaxps_avx512f(auVar75,auVar74);
      local_2180._0_8_ = auVar74._0_8_;
      local_f00 = local_2180._0_8_;
      local_2180._8_8_ = auVar74._8_8_;
      uStack_ef8 = local_2180._8_8_;
      local_2180._16_8_ = auVar74._16_8_;
      uStack_ef0 = local_2180._16_8_;
      local_2180._24_8_ = auVar74._24_8_;
      uStack_ee8 = local_2180._24_8_;
      local_2180._32_8_ = auVar74._32_8_;
      uStack_ee0 = local_2180._32_8_;
      local_2180._40_8_ = auVar74._40_8_;
      uStack_ed8 = local_2180._40_8_;
      local_2180._48_8_ = auVar74._48_8_;
      uStack_ed0 = local_2180._48_8_;
      local_2180._56_8_ = auVar74._56_8_;
      uStack_ec8 = local_2180._56_8_;
      local_f40[0] = 1.442695;
      local_f40[1] = 1.442695;
      afStack_f38[0] = 1.442695;
      afStack_f38[1] = 1.442695;
      afStack_f30[0] = 1.442695;
      afStack_f30[1] = 1.442695;
      afStack_f28[0] = 1.442695;
      afStack_f28[1] = 1.442695;
      afStack_f20[0] = 1.442695;
      afStack_f20[1] = 1.442695;
      afStack_f18[0] = 1.442695;
      afStack_f18[1] = 1.442695;
      afStack_f10[0] = 1.442695;
      afStack_f10[1] = 1.442695;
      afStack_f08[0] = 1.442695;
      afStack_f08[1] = 1.442695;
      local_f80[0] = 0.5;
      local_f80[1] = 0.5;
      afStack_f78[0] = 0.5;
      afStack_f78[1] = 0.5;
      afStack_f70[0] = 0.5;
      afStack_f70[1] = 0.5;
      afStack_f68[0] = 0.5;
      afStack_f68[1] = 0.5;
      afStack_f60[0] = 0.5;
      afStack_f60[1] = 0.5;
      afStack_f58[0] = 0.5;
      afStack_f58[1] = 0.5;
      afStack_f50[0] = 0.5;
      afStack_f50[1] = 0.5;
      afStack_f48[0] = 0.5;
      afStack_f48[1] = 0.5;
      auVar38._8_4_ = 1.442695;
      auVar38._12_4_ = 1.442695;
      auVar38._0_4_ = 1.442695;
      auVar38._4_4_ = 1.442695;
      auVar38._16_4_ = 1.442695;
      auVar38._20_4_ = 1.442695;
      auVar38._24_4_ = 1.442695;
      auVar38._28_4_ = 1.442695;
      auVar38._32_4_ = 1.442695;
      auVar38._36_4_ = 1.442695;
      auVar38._40_4_ = 1.442695;
      auVar38._44_4_ = 1.442695;
      auVar38._48_4_ = 1.442695;
      auVar38._52_4_ = 1.442695;
      auVar38._56_4_ = 1.442695;
      auVar38._60_4_ = 1.442695;
      auVar37._8_4_ = 0.5;
      auVar37._12_4_ = 0.5;
      auVar37._0_4_ = 0.5;
      auVar37._4_4_ = 0.5;
      auVar37._16_4_ = 0.5;
      auVar37._20_4_ = 0.5;
      auVar37._24_4_ = 0.5;
      auVar37._28_4_ = 0.5;
      auVar37._32_4_ = 0.5;
      auVar37._36_4_ = 0.5;
      auVar37._40_4_ = 0.5;
      auVar37._44_4_ = 0.5;
      auVar37._48_4_ = 0.5;
      auVar37._52_4_ = 0.5;
      auVar37._56_4_ = 0.5;
      auVar37._60_4_ = 0.5;
      auVar75 = vfmadd213ps_avx512f(auVar38,auVar74,auVar37);
      auVar76 = vrndscaleps_avx512f(auVar75,1);
      uVar23 = vcmpps_avx512f(auVar75,auVar76,1);
      local_2282 = (ushort)uVar23;
      local_21c0._0_8_ = auVar76._0_8_;
      local_e80 = local_21c0._0_8_;
      local_21c0._8_8_ = auVar76._8_8_;
      uStack_e78 = local_21c0._8_8_;
      local_21c0._16_8_ = auVar76._16_8_;
      uStack_e70 = local_21c0._16_8_;
      local_21c0._24_8_ = auVar76._24_8_;
      uStack_e68 = local_21c0._24_8_;
      local_21c0._32_8_ = auVar76._32_8_;
      uStack_e60 = local_21c0._32_8_;
      local_21c0._40_8_ = auVar76._40_8_;
      uStack_e58 = local_21c0._40_8_;
      local_21c0._48_8_ = auVar76._48_8_;
      uStack_e50 = local_21c0._48_8_;
      local_21c0._56_8_ = auVar76._56_8_;
      uStack_e48 = local_21c0._56_8_;
      local_ec0[0] = 1.0;
      local_ec0[1] = 1.0;
      afStack_eb8[0] = 1.0;
      afStack_eb8[1] = 1.0;
      afStack_eb0[0] = 1.0;
      afStack_eb0[1] = 1.0;
      afStack_ea8[0] = 1.0;
      afStack_ea8[1] = 1.0;
      afStack_ea0[0] = 1.0;
      afStack_ea0[1] = 1.0;
      afStack_e98[0] = 1.0;
      afStack_e98[1] = 1.0;
      afStack_e90[0] = 1.0;
      afStack_e90[1] = 1.0;
      afStack_e88[0] = 1.0;
      afStack_e88[1] = 1.0;
      local_d80 = local_21c0._0_8_;
      uStack_d78 = local_21c0._8_8_;
      uStack_d70 = local_21c0._16_8_;
      uStack_d68 = local_21c0._24_8_;
      uStack_d60 = local_21c0._32_8_;
      uStack_d58 = local_21c0._40_8_;
      uStack_d50 = local_21c0._48_8_;
      uStack_d48 = local_21c0._56_8_;
      local_dc0[0] = 1.0;
      local_dc0[1] = 1.0;
      afStack_db8[0] = 1.0;
      afStack_db8[1] = 1.0;
      afStack_db0[0] = 1.0;
      afStack_db0[1] = 1.0;
      afStack_da8[0] = 1.0;
      afStack_da8[1] = 1.0;
      afStack_da0[0] = 1.0;
      afStack_da0[1] = 1.0;
      afStack_d98[0] = 1.0;
      afStack_d98[1] = 1.0;
      afStack_d90[0] = 1.0;
      afStack_d90[1] = 1.0;
      afStack_d88[0] = 1.0;
      afStack_d88[1] = 1.0;
      auVar39._8_4_ = 1.0;
      auVar39._12_4_ = 1.0;
      auVar39._0_4_ = 1.0;
      auVar39._4_4_ = 1.0;
      auVar39._16_4_ = 1.0;
      auVar39._20_4_ = 1.0;
      auVar39._24_4_ = 1.0;
      auVar39._28_4_ = 1.0;
      auVar39._32_4_ = 1.0;
      auVar39._36_4_ = 1.0;
      auVar39._40_4_ = 1.0;
      auVar39._44_4_ = 1.0;
      auVar39._48_4_ = 1.0;
      auVar39._52_4_ = 1.0;
      auVar39._56_4_ = 1.0;
      auVar39._60_4_ = 1.0;
      local_e00._0_4_ = auVar76._0_4_;
      local_e00._4_4_ = auVar76._4_4_;
      uStack_df8._0_4_ = auVar76._8_4_;
      uStack_df8._4_4_ = auVar76._12_4_;
      uStack_df0._0_4_ = auVar76._16_4_;
      uStack_df0._4_4_ = auVar76._20_4_;
      uStack_de8._0_4_ = auVar76._24_4_;
      uStack_de8._4_4_ = auVar76._28_4_;
      uStack_de0._0_4_ = auVar76._32_4_;
      uStack_de0._4_4_ = auVar76._36_4_;
      uStack_dd8._0_4_ = auVar76._40_4_;
      uStack_dd8._4_4_ = auVar76._44_4_;
      uStack_dd0._0_4_ = auVar76._48_4_;
      uStack_dd0._4_4_ = auVar76._52_4_;
      uStack_dc8._0_4_ = auVar76._56_4_;
      uStack_dc8._4_4_ = auVar76._60_4_;
      auVar75 = vsubps_avx512f(auVar76,auVar39);
      bVar1 = (bool)((byte)uVar23 & 1);
      bVar2 = (bool)((byte)(local_2282 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2282 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2282 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2282 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2282 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2282 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2282 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar23 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2200._4_4_ = (uint)bVar2 * auVar75._4_4_ | (uint)!bVar2 * local_e00._4_4_;
      local_2200._0_4_ = (uint)bVar1 * auVar75._0_4_ | (uint)!bVar1 * (int)local_e00;
      local_2200._8_4_ = (uint)bVar3 * auVar75._8_4_ | (uint)!bVar3 * (int)uStack_df8;
      local_2200._12_4_ = (uint)bVar4 * auVar75._12_4_ | (uint)!bVar4 * uStack_df8._4_4_;
      uStack_21f0._0_4_ = (uint)bVar5 * auVar75._16_4_ | (uint)!bVar5 * (int)uStack_df0;
      uStack_21f0._4_4_ = (uint)bVar6 * auVar75._20_4_ | (uint)!bVar6 * uStack_df0._4_4_;
      auVar68 = _local_2200;
      uStack_21e8._0_4_ = (uint)bVar7 * auVar75._24_4_ | (uint)!bVar7 * (int)uStack_de8;
      uStack_21e8._4_4_ = (uint)bVar8 * auVar75._28_4_ | (uint)!bVar8 * uStack_de8._4_4_;
      auVar79 = _local_2200;
      uStack_21e0._0_4_ =
           (uint)(bVar9 & 1) * auVar75._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_de0;
      uStack_21e0._4_4_ = (uint)bVar10 * auVar75._36_4_ | (uint)!bVar10 * uStack_de0._4_4_;
      auVar69 = _local_2200;
      uStack_21d8._0_4_ = (uint)bVar11 * auVar75._40_4_ | (uint)!bVar11 * (int)uStack_dd8;
      uStack_21d8._4_4_ = (uint)bVar12 * auVar75._44_4_ | (uint)!bVar12 * uStack_dd8._4_4_;
      auVar70 = _local_2200;
      uStack_21d0._0_4_ = (uint)bVar13 * auVar75._48_4_ | (uint)!bVar13 * (int)uStack_dd0;
      uStack_21d0._4_4_ = (uint)bVar14 * auVar75._52_4_ | (uint)!bVar14 * uStack_dd0._4_4_;
      auVar71 = _local_2200;
      uStack_21c8._0_4_ = (uint)bVar15 * auVar75._56_4_ | (uint)!bVar15 * (int)uStack_dc8;
      uStack_21c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar75._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_dc8._4_4_;
      auVar75 = _local_2200;
      local_c00 = local_2200._0_8_;
      uStack_bf8 = local_2200._8_8_;
      uStack_21f0 = auVar68._16_8_;
      uStack_bf0 = uStack_21f0;
      uStack_21e8 = auVar79._24_8_;
      uStack_be8 = uStack_21e8;
      uStack_21e0 = auVar69._32_8_;
      uStack_be0 = uStack_21e0;
      uStack_21d8 = auVar70._40_8_;
      uStack_bd8 = uStack_21d8;
      uStack_21d0 = auVar71._48_8_;
      uStack_bd0 = uStack_21d0;
      uStack_21c8 = auVar75._56_8_;
      uStack_bc8 = uStack_21c8;
      local_c40[0] = 0.6933594;
      local_c40[1] = 0.6933594;
      afStack_c38[0] = 0.6933594;
      afStack_c38[1] = 0.6933594;
      afStack_c30[0] = 0.6933594;
      afStack_c30[1] = 0.6933594;
      afStack_c28[0] = 0.6933594;
      afStack_c28[1] = 0.6933594;
      afStack_c20[0] = 0.6933594;
      afStack_c20[1] = 0.6933594;
      afStack_c18[0] = 0.6933594;
      afStack_c18[1] = 0.6933594;
      afStack_c10[0] = 0.6933594;
      afStack_c10[1] = 0.6933594;
      afStack_c08[0] = 0.6933594;
      afStack_c08[1] = 0.6933594;
      local_c80 = local_2180._0_8_;
      uStack_c78 = local_2180._8_8_;
      uStack_c70 = local_2180._16_8_;
      uStack_c68 = local_2180._24_8_;
      uStack_c60 = local_2180._32_8_;
      uStack_c58 = local_2180._40_8_;
      uStack_c50 = local_2180._48_8_;
      uStack_c48 = local_2180._56_8_;
      auVar43._16_8_ = uStack_21f0;
      auVar43._0_16_ = local_2200;
      auVar43._24_8_ = uStack_21e8;
      auVar43._32_8_ = uStack_21e0;
      auVar43._40_8_ = uStack_21d8;
      auVar43._48_8_ = uStack_21d0;
      auVar43._56_8_ = uStack_21c8;
      auVar42._8_4_ = 0.6933594;
      auVar42._12_4_ = 0.6933594;
      auVar42._0_4_ = 0.6933594;
      auVar42._4_4_ = 0.6933594;
      auVar42._16_4_ = 0.6933594;
      auVar42._20_4_ = 0.6933594;
      auVar42._24_4_ = 0.6933594;
      auVar42._28_4_ = 0.6933594;
      auVar42._32_4_ = 0.6933594;
      auVar42._36_4_ = 0.6933594;
      auVar42._40_4_ = 0.6933594;
      auVar42._44_4_ = 0.6933594;
      auVar42._48_4_ = 0.6933594;
      auVar42._52_4_ = 0.6933594;
      auVar42._56_4_ = 0.6933594;
      auVar42._60_4_ = 0.6933594;
      auVar74 = vfnmadd213ps_avx512f(auVar42,auVar43,auVar74);
      local_cc0 = local_2200._0_8_;
      uStack_cb8 = local_2200._8_8_;
      uStack_cb0 = uStack_21f0;
      uStack_ca8 = uStack_21e8;
      uStack_ca0 = uStack_21e0;
      uStack_c98 = uStack_21d8;
      uStack_c90 = uStack_21d0;
      uStack_c88 = uStack_21c8;
      local_d00[0] = -0.00021219444;
      local_d00[1] = -0.00021219444;
      afStack_cf8[0] = -0.00021219444;
      afStack_cf8[1] = -0.00021219444;
      afStack_cf0[0] = -0.00021219444;
      afStack_cf0[1] = -0.00021219444;
      afStack_ce8[0] = -0.00021219444;
      afStack_ce8[1] = -0.00021219444;
      afStack_ce0[0] = -0.00021219444;
      afStack_ce0[1] = -0.00021219444;
      afStack_cd8[0] = -0.00021219444;
      afStack_cd8[1] = -0.00021219444;
      afStack_cd0[0] = -0.00021219444;
      afStack_cd0[1] = -0.00021219444;
      afStack_cc8[0] = -0.00021219444;
      afStack_cc8[1] = -0.00021219444;
      local_2180._0_8_ = auVar74._0_8_;
      local_d40 = local_2180._0_8_;
      local_2180._8_8_ = auVar74._8_8_;
      uStack_d38 = local_2180._8_8_;
      local_2180._16_8_ = auVar74._16_8_;
      uStack_d30 = local_2180._16_8_;
      local_2180._24_8_ = auVar74._24_8_;
      uStack_d28 = local_2180._24_8_;
      local_2180._32_8_ = auVar74._32_8_;
      uStack_d20 = local_2180._32_8_;
      local_2180._40_8_ = auVar74._40_8_;
      uStack_d18 = local_2180._40_8_;
      local_2180._48_8_ = auVar74._48_8_;
      uStack_d10 = local_2180._48_8_;
      local_2180._56_8_ = auVar74._56_8_;
      uStack_d08 = local_2180._56_8_;
      auVar41._16_8_ = uStack_21f0;
      auVar41._0_16_ = local_2200;
      auVar41._24_8_ = uStack_21e8;
      auVar41._32_8_ = uStack_21e0;
      auVar41._40_8_ = uStack_21d8;
      auVar41._48_8_ = uStack_21d0;
      auVar41._56_8_ = uStack_21c8;
      auVar40._8_4_ = -0.00021219444;
      auVar40._12_4_ = -0.00021219444;
      auVar40._0_4_ = -0.00021219444;
      auVar40._4_4_ = -0.00021219444;
      auVar40._16_4_ = -0.00021219444;
      auVar40._20_4_ = -0.00021219444;
      auVar40._24_4_ = -0.00021219444;
      auVar40._28_4_ = -0.00021219444;
      auVar40._32_4_ = -0.00021219444;
      auVar40._36_4_ = -0.00021219444;
      auVar40._40_4_ = -0.00021219444;
      auVar40._44_4_ = -0.00021219444;
      auVar40._48_4_ = -0.00021219444;
      auVar40._52_4_ = -0.00021219444;
      auVar40._56_4_ = -0.00021219444;
      auVar40._60_4_ = -0.00021219444;
      local_2180 = vfnmadd213ps_avx512f(auVar40,auVar41,auVar74);
      local_1f00 = local_2180._0_8_;
      uStack_1ef8 = local_2180._8_8_;
      uStack_1ef0 = local_2180._16_8_;
      uStack_1ee8 = local_2180._24_8_;
      uStack_1ee0 = local_2180._32_8_;
      uStack_1ed8 = local_2180._40_8_;
      uStack_1ed0 = local_2180._48_8_;
      uStack_1ec8 = local_2180._56_8_;
      local_21c0 = vmulps_avx512f(local_2180,local_2180);
      uStack_22f8._0_4_ = 0.00019875691;
      uStack_22f8._4_4_ = 0.00019875691;
      local_2300._0_4_ = 0.00019875691;
      local_2300._4_4_ = 0.00019875691;
      local_fc0[0] = 0.00019875691;
      local_fc0[1] = 0.00019875691;
      afStack_fb8[0] = 0.00019875691;
      afStack_fb8[1] = 0.00019875691;
      afStack_fb0[0] = 0.00019875691;
      afStack_fb0[1] = 0.00019875691;
      afStack_fa8[0] = 0.00019875691;
      afStack_fa8[1] = 0.00019875691;
      afStack_fa0[0] = 0.00019875691;
      afStack_fa0[1] = 0.00019875691;
      afStack_f98[0] = 0.00019875691;
      afStack_f98[1] = 0.00019875691;
      afStack_f90[0] = 0.00019875691;
      afStack_f90[1] = 0.00019875691;
      afStack_f88[0] = 0.00019875691;
      afStack_f88[1] = 0.00019875691;
      local_1000 = local_2180._0_8_;
      uStack_ff8 = local_2180._8_8_;
      uStack_ff0 = local_2180._16_8_;
      uStack_fe8 = local_2180._24_8_;
      uStack_fe0 = local_2180._32_8_;
      uStack_fd8 = local_2180._40_8_;
      uStack_fd0 = local_2180._48_8_;
      uStack_fc8 = local_2180._56_8_;
      local_1040[0] = 0.0013981999;
      local_1040[1] = 0.0013981999;
      afStack_1038[0] = 0.0013981999;
      afStack_1038[1] = 0.0013981999;
      afStack_1030[0] = 0.0013981999;
      afStack_1030[1] = 0.0013981999;
      afStack_1028[0] = 0.0013981999;
      afStack_1028[1] = 0.0013981999;
      afStack_1020[0] = 0.0013981999;
      afStack_1020[1] = 0.0013981999;
      afStack_1018[0] = 0.0013981999;
      afStack_1018[1] = 0.0013981999;
      afStack_1010[0] = 0.0013981999;
      afStack_1010[1] = 0.0013981999;
      afStack_1008[0] = 0.0013981999;
      afStack_1008[1] = 0.0013981999;
      auVar36._16_4_ = 0.00019875691;
      auVar36._20_4_ = 0.00019875691;
      auVar36._0_16_ = _local_2300;
      auVar36._24_4_ = 0.00019875691;
      auVar36._28_4_ = 0.00019875691;
      auVar36._32_4_ = 0.00019875691;
      auVar36._36_4_ = 0.00019875691;
      auVar36._40_4_ = 0.00019875691;
      auVar36._44_4_ = 0.00019875691;
      auVar36._48_4_ = 0.00019875691;
      auVar36._52_4_ = 0.00019875691;
      auVar36._56_4_ = 0.00019875691;
      auVar36._60_4_ = 0.00019875691;
      auVar35._8_4_ = 0.0013981999;
      auVar35._12_4_ = 0.0013981999;
      auVar35._0_4_ = 0.0013981999;
      auVar35._4_4_ = 0.0013981999;
      auVar35._16_4_ = 0.0013981999;
      auVar35._20_4_ = 0.0013981999;
      auVar35._24_4_ = 0.0013981999;
      auVar35._28_4_ = 0.0013981999;
      auVar35._32_4_ = 0.0013981999;
      auVar35._36_4_ = 0.0013981999;
      auVar35._40_4_ = 0.0013981999;
      auVar35._44_4_ = 0.0013981999;
      auVar35._48_4_ = 0.0013981999;
      auVar35._52_4_ = 0.0013981999;
      auVar35._56_4_ = 0.0013981999;
      auVar35._60_4_ = 0.0013981999;
      auVar74 = vfmadd213ps_avx512f(local_2180,auVar36,auVar35);
      local_2300 = auVar74._0_8_;
      local_1080 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_1078 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_1070 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_1068 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_1060 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_1058 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_1050 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_1048 = uStack_22c8;
      local_10c0 = local_2180._0_8_;
      uStack_10b8 = local_2180._8_8_;
      uStack_10b0 = local_2180._16_8_;
      uStack_10a8 = local_2180._24_8_;
      uStack_10a0 = local_2180._32_8_;
      uStack_1098 = local_2180._40_8_;
      uStack_1090 = local_2180._48_8_;
      uStack_1088 = local_2180._56_8_;
      local_1100[0] = 0.008333452;
      local_1100[1] = 0.008333452;
      afStack_10f8[0] = 0.008333452;
      afStack_10f8[1] = 0.008333452;
      afStack_10f0[0] = 0.008333452;
      afStack_10f0[1] = 0.008333452;
      afStack_10e8[0] = 0.008333452;
      afStack_10e8[1] = 0.008333452;
      afStack_10e0[0] = 0.008333452;
      afStack_10e0[1] = 0.008333452;
      afStack_10d8[0] = 0.008333452;
      afStack_10d8[1] = 0.008333452;
      afStack_10d0[0] = 0.008333452;
      afStack_10d0[1] = 0.008333452;
      afStack_10c8[0] = 0.008333452;
      afStack_10c8[1] = 0.008333452;
      auVar34._8_4_ = 0.008333452;
      auVar34._12_4_ = 0.008333452;
      auVar34._0_4_ = 0.008333452;
      auVar34._4_4_ = 0.008333452;
      auVar34._16_4_ = 0.008333452;
      auVar34._20_4_ = 0.008333452;
      auVar34._24_4_ = 0.008333452;
      auVar34._28_4_ = 0.008333452;
      auVar34._32_4_ = 0.008333452;
      auVar34._36_4_ = 0.008333452;
      auVar34._40_4_ = 0.008333452;
      auVar34._44_4_ = 0.008333452;
      auVar34._48_4_ = 0.008333452;
      auVar34._52_4_ = 0.008333452;
      auVar34._56_4_ = 0.008333452;
      auVar34._60_4_ = 0.008333452;
      auVar74 = vfmadd213ps_avx512f(local_2180,auVar74,auVar34);
      local_2300 = auVar74._0_8_;
      local_1140 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_1138 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_1130 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_1128 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_1120 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_1118 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_1110 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_1108 = uStack_22c8;
      local_1180 = local_2180._0_8_;
      uStack_1178 = local_2180._8_8_;
      uStack_1170 = local_2180._16_8_;
      uStack_1168 = local_2180._24_8_;
      uStack_1160 = local_2180._32_8_;
      uStack_1158 = local_2180._40_8_;
      uStack_1150 = local_2180._48_8_;
      uStack_1148 = local_2180._56_8_;
      local_11c0[0] = 0.041665796;
      local_11c0[1] = 0.041665796;
      afStack_11b8[0] = 0.041665796;
      afStack_11b8[1] = 0.041665796;
      afStack_11b0[0] = 0.041665796;
      afStack_11b0[1] = 0.041665796;
      afStack_11a8[0] = 0.041665796;
      afStack_11a8[1] = 0.041665796;
      afStack_11a0[0] = 0.041665796;
      afStack_11a0[1] = 0.041665796;
      afStack_1198[0] = 0.041665796;
      afStack_1198[1] = 0.041665796;
      afStack_1190[0] = 0.041665796;
      afStack_1190[1] = 0.041665796;
      afStack_1188[0] = 0.041665796;
      afStack_1188[1] = 0.041665796;
      auVar33._8_4_ = 0.041665796;
      auVar33._12_4_ = 0.041665796;
      auVar33._0_4_ = 0.041665796;
      auVar33._4_4_ = 0.041665796;
      auVar33._16_4_ = 0.041665796;
      auVar33._20_4_ = 0.041665796;
      auVar33._24_4_ = 0.041665796;
      auVar33._28_4_ = 0.041665796;
      auVar33._32_4_ = 0.041665796;
      auVar33._36_4_ = 0.041665796;
      auVar33._40_4_ = 0.041665796;
      auVar33._44_4_ = 0.041665796;
      auVar33._48_4_ = 0.041665796;
      auVar33._52_4_ = 0.041665796;
      auVar33._56_4_ = 0.041665796;
      auVar33._60_4_ = 0.041665796;
      auVar74 = vfmadd213ps_avx512f(local_2180,auVar74,auVar33);
      local_2300 = auVar74._0_8_;
      local_1200 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_11f8 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_11f0 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_11e8 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_11e0 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_11d8 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_11d0 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_11c8 = uStack_22c8;
      local_1240 = local_2180._0_8_;
      uStack_1238 = local_2180._8_8_;
      uStack_1230 = local_2180._16_8_;
      uStack_1228 = local_2180._24_8_;
      uStack_1220 = local_2180._32_8_;
      uStack_1218 = local_2180._40_8_;
      uStack_1210 = local_2180._48_8_;
      uStack_1208 = local_2180._56_8_;
      local_1280[0] = 0.16666666;
      local_1280[1] = 0.16666666;
      afStack_1278[0] = 0.16666666;
      afStack_1278[1] = 0.16666666;
      afStack_1270[0] = 0.16666666;
      afStack_1270[1] = 0.16666666;
      afStack_1268[0] = 0.16666666;
      afStack_1268[1] = 0.16666666;
      afStack_1260[0] = 0.16666666;
      afStack_1260[1] = 0.16666666;
      afStack_1258[0] = 0.16666666;
      afStack_1258[1] = 0.16666666;
      afStack_1250[0] = 0.16666666;
      afStack_1250[1] = 0.16666666;
      afStack_1248[0] = 0.16666666;
      afStack_1248[1] = 0.16666666;
      auVar32._8_4_ = 0.16666666;
      auVar32._12_4_ = 0.16666666;
      auVar32._0_4_ = 0.16666666;
      auVar32._4_4_ = 0.16666666;
      auVar32._16_4_ = 0.16666666;
      auVar32._20_4_ = 0.16666666;
      auVar32._24_4_ = 0.16666666;
      auVar32._28_4_ = 0.16666666;
      auVar32._32_4_ = 0.16666666;
      auVar32._36_4_ = 0.16666666;
      auVar32._40_4_ = 0.16666666;
      auVar32._44_4_ = 0.16666666;
      auVar32._48_4_ = 0.16666666;
      auVar32._52_4_ = 0.16666666;
      auVar32._56_4_ = 0.16666666;
      auVar32._60_4_ = 0.16666666;
      auVar74 = vfmadd213ps_avx512f(local_2180,auVar74,auVar32);
      local_2300 = auVar74._0_8_;
      local_12c0 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_12b8 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_12b0 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_12a8 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_12a0 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_1298 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_1290 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_1288 = uStack_22c8;
      local_1300 = local_2180._0_8_;
      uStack_12f8 = local_2180._8_8_;
      uStack_12f0 = local_2180._16_8_;
      uStack_12e8 = local_2180._24_8_;
      uStack_12e0 = local_2180._32_8_;
      uStack_12d8 = local_2180._40_8_;
      uStack_12d0 = local_2180._48_8_;
      uStack_12c8 = local_2180._56_8_;
      local_1340[0] = 0.5;
      local_1340[1] = 0.5;
      afStack_1338[0] = 0.5;
      afStack_1338[1] = 0.5;
      afStack_1330[0] = 0.5;
      afStack_1330[1] = 0.5;
      afStack_1328[0] = 0.5;
      afStack_1328[1] = 0.5;
      afStack_1320[0] = 0.5;
      afStack_1320[1] = 0.5;
      afStack_1318[0] = 0.5;
      afStack_1318[1] = 0.5;
      afStack_1310[0] = 0.5;
      afStack_1310[1] = 0.5;
      afStack_1308[0] = 0.5;
      afStack_1308[1] = 0.5;
      auVar77._8_4_ = 0.5;
      auVar77._12_4_ = 0.5;
      auVar77._0_4_ = 0.5;
      auVar77._4_4_ = 0.5;
      auVar77._16_4_ = 0.5;
      auVar77._20_4_ = 0.5;
      auVar77._24_4_ = 0.5;
      auVar77._28_4_ = 0.5;
      auVar77._32_4_ = 0.5;
      auVar77._36_4_ = 0.5;
      auVar77._40_4_ = 0.5;
      auVar77._44_4_ = 0.5;
      auVar77._48_4_ = 0.5;
      auVar77._52_4_ = 0.5;
      auVar77._56_4_ = 0.5;
      auVar77._60_4_ = 0.5;
      auVar74 = vfmadd213ps_avx512f(local_2180,auVar74,auVar77);
      local_2300 = auVar74._0_8_;
      local_1380 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_1378 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_1370 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_1368 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_1360 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_1358 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_1350 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_1348 = uStack_22c8;
      local_13c0 = local_21c0._0_8_;
      uStack_13b8 = local_21c0._8_8_;
      uStack_13b0 = local_21c0._16_8_;
      uStack_13a8 = local_21c0._24_8_;
      uStack_13a0 = local_21c0._32_8_;
      uStack_1398 = local_21c0._40_8_;
      uStack_1390 = local_21c0._48_8_;
      uStack_1388 = local_21c0._56_8_;
      local_1400 = local_2180._0_8_;
      uStack_13f8 = local_2180._8_8_;
      uStack_13f0 = local_2180._16_8_;
      uStack_13e8 = local_2180._24_8_;
      uStack_13e0 = local_2180._32_8_;
      uStack_13d8 = local_2180._40_8_;
      uStack_13d0 = local_2180._48_8_;
      uStack_13c8 = local_2180._56_8_;
      auVar74 = vfmadd213ps_avx512f(local_21c0,auVar74,local_2180);
      local_2300 = auVar74._0_8_;
      local_1d40 = local_2300;
      uStack_22f8 = auVar74._8_8_;
      uStack_1d38 = uStack_22f8;
      uStack_22f0 = auVar74._16_8_;
      uStack_1d30 = uStack_22f0;
      uStack_22e8 = auVar74._24_8_;
      uStack_1d28 = uStack_22e8;
      uStack_22e0 = auVar74._32_8_;
      uStack_1d20 = uStack_22e0;
      uStack_22d8 = auVar74._40_8_;
      uStack_1d18 = uStack_22d8;
      uStack_22d0 = auVar74._48_8_;
      uStack_1d10 = uStack_22d0;
      uStack_22c8 = auVar74._56_8_;
      uStack_1d08 = uStack_22c8;
      local_1d80[0] = 1.0;
      local_1d80[1] = 1.0;
      afStack_1d78[0] = 1.0;
      afStack_1d78[1] = 1.0;
      afStack_1d70[0] = 1.0;
      afStack_1d70[1] = 1.0;
      afStack_1d68[0] = 1.0;
      afStack_1d68[1] = 1.0;
      afStack_1d60[0] = 1.0;
      afStack_1d60[1] = 1.0;
      afStack_1d58[0] = 1.0;
      afStack_1d58[1] = 1.0;
      afStack_1d50[0] = 1.0;
      afStack_1d50[1] = 1.0;
      afStack_1d48[0] = 1.0;
      afStack_1d48[1] = 1.0;
      auVar76._8_4_ = 1.0;
      auVar76._12_4_ = 1.0;
      auVar76._0_4_ = 1.0;
      auVar76._4_4_ = 1.0;
      auVar76._16_4_ = 1.0;
      auVar76._20_4_ = 1.0;
      auVar76._24_4_ = 1.0;
      auVar76._28_4_ = 1.0;
      auVar76._32_4_ = 1.0;
      auVar76._36_4_ = 1.0;
      auVar76._40_4_ = 1.0;
      auVar76._44_4_ = 1.0;
      auVar76._48_4_ = 1.0;
      auVar76._52_4_ = 1.0;
      auVar76._56_4_ = 1.0;
      auVar76._60_4_ = 1.0;
      auVar76 = vaddps_avx512f(auVar74,auVar76);
      local_bc0 = local_2200._0_8_;
      uStack_bb8 = local_2200._8_8_;
      uStack_bb0 = uStack_21f0;
      uStack_ba8 = uStack_21e8;
      uStack_ba0 = uStack_21e0;
      uStack_b98 = uStack_21d8;
      uStack_b90 = uStack_21d0;
      uStack_b88 = uStack_21c8;
      auVar44._16_8_ = uStack_21f0;
      auVar44._0_16_ = local_2200;
      auVar44._24_8_ = uStack_21e8;
      auVar44._32_8_ = uStack_21e0;
      auVar44._40_8_ = uStack_21d8;
      auVar44._48_8_ = uStack_21d0;
      auVar44._56_8_ = uStack_21c8;
      local_a40 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(local_a40);
      auVar74 = vcvttps2dq_avx512f(auVar44);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar77 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_b40 = vmovdqa64_avx512f(auVar74);
      local_b80 = vmovdqa64_avx512f(auVar77);
      auVar74 = vmovdqa64_avx512f(local_b40);
      auVar77 = vmovdqa64_avx512f(local_b80);
      auVar74 = vpaddd_avx512f(auVar74,auVar77);
      auVar74 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(auVar74);
      local_ac0 = vmovdqa64_avx512f(auVar74);
      local_ac4 = 0x17;
      auVar74 = vmovdqa64_avx512f(local_ac0);
      auVar74 = vpslld_avx512f(auVar74,ZEXT416(0x17));
      local_2240 = vmovdqa64_avx512f(auVar74);
      auVar74 = vmovdqa64_avx512f(local_2240);
      local_a80 = vmovdqa64_avx512f(auVar74);
      local_2340 = vmovdqa64_avx512f(local_a80);
      local_2300 = auVar76._0_8_;
      local_1f40 = local_2300;
      uStack_22f8 = auVar76._8_8_;
      uStack_1f38 = uStack_22f8;
      uStack_22f0 = auVar76._16_8_;
      uStack_1f30 = uStack_22f0;
      uStack_22e8 = auVar76._24_8_;
      uStack_1f28 = uStack_22e8;
      uStack_22e0 = auVar76._32_8_;
      uStack_1f20 = uStack_22e0;
      uStack_22d8 = auVar76._40_8_;
      uStack_1f18 = uStack_22d8;
      uStack_22d0 = auVar76._48_8_;
      uStack_1f10 = uStack_22d0;
      uStack_22c8 = auVar76._56_8_;
      uStack_1f08 = uStack_22c8;
      local_1f80 = local_2340._0_8_;
      uStack_1f78 = local_2340._8_8_;
      uStack_1f70 = local_2340._16_8_;
      uStack_1f68 = local_2340._24_8_;
      uStack_1f60 = local_2340._32_8_;
      uStack_1f58 = local_2340._40_8_;
      uStack_1f50 = local_2340._48_8_;
      uStack_1f48 = local_2340._56_8_;
      _local_2300 = vmulps_avx512f(auVar76,local_2340);
      local_1fc0 = local_2300;
      uStack_1fb8 = uStack_22f8;
      uStack_1fb0 = uStack_22f0;
      uStack_1fa8 = uStack_22e8;
      uStack_1fa0 = uStack_22e0;
      uStack_1f98 = uStack_22d8;
      uStack_1f90 = uStack_22d0;
      uStack_1f88 = uStack_22c8;
      local_2000 = local_24c0._0_8_;
      uStack_1ff8 = local_24c0._8_8_;
      uStack_1ff0 = local_24c0._16_8_;
      uStack_1fe8 = local_24c0._24_8_;
      uStack_1fe0 = local_24c0._32_8_;
      uStack_1fd8 = local_24c0._40_8_;
      uStack_1fd0 = local_24c0._48_8_;
      uStack_1fc8 = local_24c0._56_8_;
      auVar74 = vsubps_avx512f(_local_2300,local_24c0);
      local_1dc0 = local_2540._0_8_;
      uStack_1db8 = local_2540._8_8_;
      uStack_1db0 = local_2540._16_8_;
      uStack_1da8 = local_2540._24_8_;
      uStack_1da0 = local_2540._32_8_;
      uStack_1d98 = local_2540._40_8_;
      uStack_1d90 = local_2540._48_8_;
      uStack_1d88 = local_2540._56_8_;
      local_2900 = auVar74._0_8_;
      local_1e00 = local_2900;
      uStack_28f8 = auVar74._8_8_;
      uStack_1df8 = uStack_28f8;
      uStack_28f0 = auVar74._16_8_;
      uStack_1df0 = uStack_28f0;
      uStack_28e8 = auVar74._24_8_;
      uStack_1de8 = uStack_28e8;
      uStack_28e0 = auVar74._32_8_;
      uStack_1de0 = uStack_28e0;
      uStack_28d8 = auVar74._40_8_;
      uStack_1dd8 = uStack_28d8;
      uStack_28d0 = auVar74._48_8_;
      uStack_1dd0 = uStack_28d0;
      uStack_28c8 = auVar74._56_8_;
      uStack_1dc8 = uStack_28c8;
      auVar74 = vmulps_avx512f(local_2540,auVar74);
      local_1e40 = local_25c0._0_8_;
      uStack_1e38 = local_25c0._8_8_;
      uStack_1e30 = local_25c0._16_8_;
      uStack_1e28 = local_25c0._24_8_;
      uStack_1e20 = local_25c0._32_8_;
      uStack_1e18 = local_25c0._40_8_;
      uStack_1e10 = local_25c0._48_8_;
      uStack_1e08 = local_25c0._56_8_;
      local_2880 = auVar73._0_8_;
      local_1cc0 = local_2880;
      uStack_2878 = auVar73._8_8_;
      uStack_1cb8 = uStack_2878;
      uStack_2870 = auVar73._16_8_;
      uStack_1cb0 = uStack_2870;
      uStack_2868 = auVar73._24_8_;
      uStack_1ca8 = uStack_2868;
      uStack_2860 = auVar73._32_8_;
      uStack_1ca0 = uStack_2860;
      uStack_2858 = auVar73._40_8_;
      uStack_1c98 = uStack_2858;
      uStack_2850 = auVar73._48_8_;
      uStack_1c90 = uStack_2850;
      uStack_2848 = auVar73._56_8_;
      uStack_1c88 = uStack_2848;
      local_2900 = auVar74._0_8_;
      local_1d00 = local_2900;
      uStack_28f8 = auVar74._8_8_;
      uStack_1cf8 = uStack_28f8;
      uStack_28f0 = auVar74._16_8_;
      uStack_1cf0 = uStack_28f0;
      uStack_28e8 = auVar74._24_8_;
      uStack_1ce8 = uStack_28e8;
      uStack_28e0 = auVar74._32_8_;
      uStack_1ce0 = uStack_28e0;
      uStack_28d8 = auVar74._40_8_;
      uStack_1cd8 = uStack_28d8;
      uStack_28d0 = auVar74._48_8_;
      uStack_1cd0 = uStack_28d0;
      uStack_28c8 = auVar74._56_8_;
      uStack_1cc8 = uStack_28c8;
      local_1e80 = vaddps_avx512f(auVar73,auVar74);
      auVar74 = vmulps_avx512f(local_25c0,local_1e80);
      local_1c08 = local_2678;
      local_2900 = auVar74._0_8_;
      local_1c80 = local_2900;
      uStack_28f8 = auVar74._8_8_;
      uStack_1c78 = uStack_28f8;
      uStack_28f0 = auVar74._16_8_;
      uStack_1c70 = uStack_28f0;
      uStack_28e8 = auVar74._24_8_;
      uStack_1c68 = uStack_28e8;
      uStack_28e0 = auVar74._32_8_;
      uStack_1c60 = uStack_28e0;
      uStack_28d8 = auVar74._40_8_;
      uStack_1c58 = uStack_28d8;
      uStack_28d0 = auVar74._48_8_;
      uStack_1c50 = uStack_28d0;
      uStack_28c8 = auVar74._56_8_;
      uStack_1c48 = uStack_28c8;
      *(undefined8 *)*local_2678 = local_2900;
      *(undefined8 *)(*local_2678 + 8) = uStack_28f8;
      *(undefined8 *)(*local_2678 + 0x10) = uStack_28f0;
      *(undefined8 *)(*local_2678 + 0x18) = uStack_28e8;
      *(undefined8 *)(*local_2678 + 0x20) = uStack_28e0;
      *(undefined8 *)(*local_2678 + 0x28) = uStack_28d8;
      *(undefined8 *)(*local_2678 + 0x30) = uStack_28d0;
      *(undefined8 *)(*local_2678 + 0x38) = uStack_28c8;
      local_2678 = local_2678 + 1;
      local_23c0 = local_2440;
      uStack_23b8 = uStack_2438;
      uStack_23b0 = uStack_2430;
      uStack_23a8 = uStack_2428;
      uStack_23a0 = uStack_2420;
      uStack_2398 = uStack_2418;
      uStack_2390 = uStack_2410;
      uStack_2388 = uStack_2408;
      _local_2200 = auVar75;
      local_1ec0 = local_1f00;
      uStack_1eb8 = uStack_1ef8;
      uStack_1eb0 = uStack_1ef0;
      uStack_1ea8 = uStack_1ee8;
      uStack_1ea0 = uStack_1ee0;
      uStack_1e98 = uStack_1ed8;
      uStack_1e90 = uStack_1ed0;
      uStack_1e88 = uStack_1ec8;
      local_e02 = local_2282;
      local_e00 = local_e80;
      uStack_df8 = uStack_e78;
      uStack_df0 = uStack_e70;
      uStack_de8 = uStack_e68;
      uStack_de0 = uStack_e60;
      uStack_dd8 = uStack_e58;
      uStack_dd0 = uStack_e50;
      uStack_dc8 = uStack_e48;
    }
    local_1c00 = 0;
    uStack_1bf8 = 0;
    uStack_1bf0 = 0;
    uStack_1be8 = 0;
    local_1bcc = 0x3f800000;
    local_9c4 = 0x3f800000;
    local_9c8 = 0x3f800000;
    local_9cc = 0x3f800000;
    local_9d0 = 0x3f800000;
    local_9d4 = 0x3f800000;
    local_9d8 = 0x3f800000;
    local_9dc = 0x3f800000;
    local_9e0 = 0x3f800000;
    auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
    local_a00 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
    auStack_9f0 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
    local_1bd0 = *(uint *)(in_RDI + 0xd0);
    auVar16 = vinsertps_avx(ZEXT416(local_1bd0),ZEXT416(local_1bd0),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_1bd0),0x20);
    local_9c0 = vinsertps_avx(auVar16,ZEXT416(local_1bd0),0x30);
    auVar16 = vinsertps_avx(ZEXT416(local_1bd0),ZEXT416(local_1bd0),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_1bd0),0x20);
    auStack_9b0 = vinsertps_avx(auVar16,ZEXT416(local_1bd0),0x30);
    local_1bd4 = *(uint *)(in_RDI + 0xd4);
    auVar16 = vinsertps_avx(ZEXT416(local_1bd4),ZEXT416(local_1bd4),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_1bd4),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(local_1bd4),0x30);
    auVar17 = vinsertps_avx(ZEXT416(local_1bd4),ZEXT416(local_1bd4),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_1bd4),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(local_1bd4),0x30);
    auVar79._16_16_ = auVar16;
    auVar79._0_16_ = auVar17;
    local_980._0_8_ = auVar17._0_8_;
    local_980._8_8_ = auVar17._8_8_;
    local_980._16_8_ = auVar16._0_8_;
    local_980._24_8_ = auVar16._8_8_;
    for (; local_26d0 + 7 < local_2668; local_26d0 = local_26d0 + 8) {
      local_1bc8 = local_2678;
      local_1bc0 = *(undefined8 *)*local_2678;
      uStack_1bb8 = *(undefined8 *)(*local_2678 + 8);
      uStack_1bb0 = *(undefined8 *)(*local_2678 + 0x10);
      uStack_1ba8 = *(undefined8 *)(*local_2678 + 0x18);
      local_1ba0 = 0;
      uStack_1b98 = 0;
      uStack_1b90 = 0;
      uStack_1b88 = 0;
      auVar19 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2678);
      local_1b60 = 0;
      uStack_1b58 = 0;
      uStack_1b50 = 0;
      uStack_1b48 = 0;
      auVar21 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2678);
      local_29e0 = auVar21._0_8_;
      uStack_29d8 = auVar21._8_8_;
      uStack_29d0 = auVar21._16_8_;
      uStack_29c8 = auVar21._24_8_;
      local_1a40 = 0;
      uStack_1a38 = 0;
      uStack_1a30 = 0;
      uStack_1a28 = 0;
      local_1ae0 = 0x3f800000;
      uStack_1adc = 0x3f800000;
      uStack_1ad8 = 0x3f800000;
      uStack_1ad4 = 0x3f800000;
      uStack_1ad0 = 0x3f800000;
      uStack_1acc = 0x3f800000;
      uStack_1ac8 = 0x3f800000;
      uStack_1ac4 = 0x3f800000;
      local_19c0 = local_29e0;
      uStack_19b8 = uStack_29d8;
      uStack_19b0 = uStack_29d0;
      uStack_19a8 = uStack_29c8;
      local_19e0 = 0x42b0c0a5;
      uStack_19dc = 0x42b0c0a5;
      uStack_19d8 = 0x42b0c0a5;
      uStack_19d4 = 0x42b0c0a5;
      uStack_19d0 = 0x42b0c0a5;
      uStack_19cc = 0x42b0c0a5;
      uStack_19c8 = 0x42b0c0a5;
      uStack_19c4 = 0x42b0c0a5;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar22._16_4_ = 0x42b0c0a5;
      auVar22._20_4_ = 0x42b0c0a5;
      auVar22._24_4_ = 0x42b0c0a5;
      auVar22._28_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar21,auVar22);
      local_1a60._0_8_ = auVar21._0_8_;
      local_1a00 = local_1a60._0_8_;
      local_1a60._8_8_ = auVar21._8_8_;
      uStack_19f8 = local_1a60._8_8_;
      local_1a60._16_8_ = auVar21._16_8_;
      uStack_19f0 = local_1a60._16_8_;
      local_1a60._24_8_ = auVar21._24_8_;
      uStack_19e8 = local_1a60._24_8_;
      local_1a20 = 0xc2b0c0a5;
      uStack_1a1c = 0xc2b0c0a5;
      uStack_1a18 = 0xc2b0c0a5;
      uStack_1a14 = 0xc2b0c0a5;
      uStack_1a10 = 0xc2b0c0a5;
      uStack_1a0c = 0xc2b0c0a5;
      uStack_1a08 = 0xc2b0c0a5;
      uStack_1a04 = 0xc2b0c0a5;
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar20._16_4_ = 0xc2b0c0a5;
      auVar20._20_4_ = 0xc2b0c0a5;
      auVar20._24_4_ = 0xc2b0c0a5;
      auVar20._28_4_ = 0xc2b0c0a5;
      auVar20 = vmaxps_avx(auVar21,auVar20);
      local_928 = local_1a60;
      local_890 = ::_ps256_cephes_LOG2EF;
      local_898 = ::_ps256_0p5;
      local_1a60._0_8_ = auVar20._0_8_;
      local_700 = local_1a60._0_8_;
      local_1a60._8_8_ = auVar20._8_8_;
      uStack_6f8 = local_1a60._8_8_;
      local_1a60._16_8_ = auVar20._16_8_;
      uStack_6f0 = local_1a60._16_8_;
      local_1a60._24_8_ = auVar20._24_8_;
      uStack_6e8 = local_1a60._24_8_;
      local_720[0] = 1.442695;
      local_720[1] = 1.442695;
      afStack_718[0] = 1.442695;
      afStack_718[1] = 1.442695;
      afStack_710[0] = 1.442695;
      afStack_710[1] = 1.442695;
      afStack_708[0] = 1.442695;
      afStack_708[1] = 1.442695;
      local_740[0] = 0.5;
      local_740[1] = 0.5;
      afStack_738[0] = 0.5;
      afStack_738[1] = 0.5;
      afStack_730[0] = 0.5;
      afStack_730[1] = 0.5;
      afStack_728[0] = 0.5;
      afStack_728[1] = 0.5;
      auVar46._8_4_ = 1.442695;
      auVar46._12_4_ = 1.442695;
      auVar46._0_4_ = 1.442695;
      auVar46._4_4_ = 1.442695;
      auVar46._16_4_ = 1.442695;
      auVar46._20_4_ = 1.442695;
      auVar46._24_4_ = 1.442695;
      auVar46._28_4_ = 1.442695;
      auVar45._8_4_ = 0.5;
      auVar45._12_4_ = 0.5;
      auVar45._0_4_ = 0.5;
      auVar45._4_4_ = 0.5;
      auVar45._16_4_ = 0.5;
      auVar45._20_4_ = 0.5;
      auVar45._24_4_ = 0.5;
      auVar45._28_4_ = 0.5;
      auVar24 = vfmadd213ps_fma(auVar46,auVar20,auVar45);
      auVar22 = vroundps_avx(ZEXT1632(auVar24),1);
      auVar21 = vcmpps_avx(ZEXT1632(auVar24),auVar22,1);
      local_1b00._0_8_ = auVar21._0_8_;
      local_860 = local_1b00._0_8_;
      local_1b00._8_8_ = auVar21._8_8_;
      uStack_858 = local_1b00._8_8_;
      local_1b00._16_8_ = auVar21._16_8_;
      uStack_850 = local_1b00._16_8_;
      local_1b00._24_8_ = auVar21._24_8_;
      uStack_848 = local_1b00._24_8_;
      local_880 = 0x3f8000003f800000;
      uStack_878 = 0x3f8000003f800000;
      uStack_870 = 0x3f8000003f800000;
      uStack_868 = 0x3f8000003f800000;
      auVar80._8_8_ = 0x3f8000003f800000;
      auVar80._0_8_ = 0x3f8000003f800000;
      auVar80._16_8_ = 0x3f8000003f800000;
      auVar80._24_8_ = 0x3f8000003f800000;
      local_1b00 = vpand_avx2(auVar21,auVar80);
      local_1a80 = auVar22._0_8_;
      local_1980 = local_1a80;
      uStack_1a78 = auVar22._8_8_;
      uStack_1978 = uStack_1a78;
      uStack_1a70 = auVar22._16_8_;
      uStack_1970 = uStack_1a70;
      uStack_1a68 = auVar22._24_8_;
      uStack_1968 = uStack_1a68;
      local_19a0 = local_1b00._0_8_;
      uStack_1998 = local_1b00._8_8_;
      uStack_1990 = local_1b00._16_8_;
      uStack_1988 = local_1b00._24_8_;
      local_1aa0 = vsubps_avx(auVar22,local_1b00);
      local_820 = local_1aa0;
      local_810 = ::_ps256_cephes_exp_C1;
      local_460 = local_1aa0._0_8_;
      uStack_458 = local_1aa0._8_8_;
      uStack_450 = local_1aa0._16_8_;
      uStack_448 = local_1aa0._24_8_;
      local_480[0] = 0.6933594;
      local_480[1] = 0.6933594;
      afStack_478[0] = 0.6933594;
      afStack_478[1] = 0.6933594;
      afStack_470[0] = 0.6933594;
      afStack_470[1] = 0.6933594;
      afStack_468[0] = 0.6933594;
      afStack_468[1] = 0.6933594;
      local_4a0 = local_1a60._0_8_;
      uStack_498 = local_1a60._8_8_;
      uStack_490 = local_1a60._16_8_;
      uStack_488 = local_1a60._24_8_;
      auVar52._8_4_ = 0.6933594;
      auVar52._12_4_ = 0.6933594;
      auVar52._0_4_ = 0.6933594;
      auVar52._4_4_ = 0.6933594;
      auVar52._16_4_ = 0.6933594;
      auVar52._20_4_ = 0.6933594;
      auVar52._24_4_ = 0.6933594;
      auVar52._28_4_ = 0.6933594;
      auVar24 = vfnmadd213ps_fma(auVar52,local_1aa0,auVar20);
      local_828 = ::_ps256_cephes_exp_C2;
      local_400 = local_1aa0._0_8_;
      uStack_3f8 = local_1aa0._8_8_;
      uStack_3f0 = local_1aa0._16_8_;
      uStack_3e8 = local_1aa0._24_8_;
      local_420[0] = -0.00021219444;
      local_420[1] = -0.00021219444;
      afStack_418[0] = -0.00021219444;
      afStack_418[1] = -0.00021219444;
      afStack_410[0] = -0.00021219444;
      afStack_410[1] = -0.00021219444;
      afStack_408[0] = -0.00021219444;
      afStack_408[1] = -0.00021219444;
      local_1a60._0_8_ = auVar24._0_8_;
      local_440 = local_1a60._0_8_;
      local_1a60._8_8_ = auVar24._8_8_;
      uStack_438 = local_1a60._8_8_;
      uStack_430 = 0;
      uStack_428 = 0;
      auVar53._8_4_ = -0.00021219444;
      auVar53._12_4_ = -0.00021219444;
      auVar53._0_4_ = -0.00021219444;
      auVar53._4_4_ = -0.00021219444;
      auVar53._16_4_ = -0.00021219444;
      auVar53._20_4_ = -0.00021219444;
      auVar53._24_4_ = -0.00021219444;
      auVar53._28_4_ = -0.00021219444;
      auVar24 = vfnmadd213ps_fma(auVar53,local_1aa0,ZEXT1632(auVar24));
      auVar80 = ZEXT1632(auVar24);
      local_1a60._0_8_ = auVar24._0_8_;
      local_18e0 = local_1a60._0_8_;
      local_1a60._8_8_ = auVar24._8_8_;
      uStack_18d8 = local_1a60._8_8_;
      uStack_18d0 = 0;
      uStack_18c8 = 0;
      local_18c0._0_4_ = auVar24._0_4_;
      local_18c0._4_4_ = auVar24._4_4_;
      uStack_18b8._0_4_ = auVar24._8_4_;
      uStack_18b8._4_4_ = auVar24._12_4_;
      local_1a80._4_4_ = local_18c0._4_4_ * local_18c0._4_4_;
      local_1a80._0_4_ = (float)local_18c0 * (float)local_18c0;
      local_4e0 = local_1a80;
      uStack_1a78._0_4_ = (float)uStack_18b8 * (float)uStack_18b8;
      uStack_1a78._4_4_ = uStack_18b8._4_4_ * uStack_18b8._4_4_;
      auVar18 = _local_1a80;
      _local_1a80 = ZEXT1632(_local_1a80);
      auVar22 = _local_1a80;
      uStack_1b18._0_4_ = 0x39506967;
      local_1b20 = (undefined1  [8])0x3950696739506967;
      uStack_1b18._4_4_ = 0x39506967;
      uStack_1b10._0_4_ = 0x39506967;
      uStack_1b10._4_4_ = 0x39506967;
      auVar68 = _local_1b20;
      uStack_1b08._0_4_ = 0x39506967;
      uStack_1b08._4_4_ = 0x39506967;
      auVar21 = _local_1b20;
      local_918 = local_1b20;
      local_8b0 = ::_ps256_cephes_exp_p1;
      local_6a0 = 0x3950696739506967;
      uStack_698 = uStack_1b18;
      uStack_1b10 = auVar68._16_8_;
      uStack_690 = uStack_1b10;
      uStack_1b08 = auVar21._24_8_;
      uStack_688 = uStack_1b08;
      local_6c0 = local_1a60._0_8_;
      uStack_6b8 = local_1a60._8_8_;
      uStack_6b0 = 0;
      uStack_6a8 = 0;
      local_6e0[0] = 0.0013981999;
      local_6e0[1] = 0.0013981999;
      afStack_6d8[0] = 0.0013981999;
      afStack_6d8[1] = 0.0013981999;
      afStack_6d0[0] = 0.0013981999;
      afStack_6d0[1] = 0.0013981999;
      afStack_6c8[0] = 0.0013981999;
      afStack_6c8[1] = 0.0013981999;
      auVar47._8_4_ = 0.0013981999;
      auVar47._12_4_ = 0.0013981999;
      auVar47._0_4_ = 0.0013981999;
      auVar47._4_4_ = 0.0013981999;
      auVar47._16_4_ = 0.0013981999;
      auVar47._20_4_ = 0.0013981999;
      auVar47._24_4_ = 0.0013981999;
      auVar47._28_4_ = 0.0013981999;
      auVar24 = vfmadd213ps_fma(auVar80,auVar21,auVar47);
      local_8c8 = ::_ps256_cephes_exp_p2;
      local_1b20 = auVar24._0_8_;
      local_640 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uStack_638 = uStack_1b18;
      uStack_630 = 0;
      uStack_628 = 0;
      local_660 = local_1a60._0_8_;
      uStack_658 = local_1a60._8_8_;
      uStack_650 = 0;
      uStack_648 = 0;
      local_680[0] = 0.008333452;
      local_680[1] = 0.008333452;
      afStack_678[0] = 0.008333452;
      afStack_678[1] = 0.008333452;
      afStack_670[0] = 0.008333452;
      afStack_670[1] = 0.008333452;
      afStack_668[0] = 0.008333452;
      afStack_668[1] = 0.008333452;
      auVar48._8_4_ = 0.008333452;
      auVar48._12_4_ = 0.008333452;
      auVar48._0_4_ = 0.008333452;
      auVar48._4_4_ = 0.008333452;
      auVar48._16_4_ = 0.008333452;
      auVar48._20_4_ = 0.008333452;
      auVar48._24_4_ = 0.008333452;
      auVar48._28_4_ = 0.008333452;
      auVar24 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar24),auVar48);
      local_8e0 = ::_ps256_cephes_exp_p3;
      local_1b20 = auVar24._0_8_;
      local_5e0 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uStack_5d8 = uStack_1b18;
      uStack_5d0 = 0;
      uStack_5c8 = 0;
      local_600 = local_1a60._0_8_;
      uStack_5f8 = local_1a60._8_8_;
      uStack_5f0 = 0;
      uStack_5e8 = 0;
      local_620[0] = 0.041665796;
      local_620[1] = 0.041665796;
      afStack_618[0] = 0.041665796;
      afStack_618[1] = 0.041665796;
      afStack_610[0] = 0.041665796;
      afStack_610[1] = 0.041665796;
      afStack_608[0] = 0.041665796;
      afStack_608[1] = 0.041665796;
      auVar49._8_4_ = 0.041665796;
      auVar49._12_4_ = 0.041665796;
      auVar49._0_4_ = 0.041665796;
      auVar49._4_4_ = 0.041665796;
      auVar49._16_4_ = 0.041665796;
      auVar49._20_4_ = 0.041665796;
      auVar49._24_4_ = 0.041665796;
      auVar49._28_4_ = 0.041665796;
      auVar24 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar24),auVar49);
      local_8f8 = ::_ps256_cephes_exp_p4;
      local_1b20 = auVar24._0_8_;
      local_580 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uStack_578 = uStack_1b18;
      uStack_570 = 0;
      uStack_568 = 0;
      local_5a0 = local_1a60._0_8_;
      uStack_598 = local_1a60._8_8_;
      uStack_590 = 0;
      uStack_588 = 0;
      local_5c0[0] = 0.16666666;
      local_5c0[1] = 0.16666666;
      afStack_5b8[0] = 0.16666666;
      afStack_5b8[1] = 0.16666666;
      afStack_5b0[0] = 0.16666666;
      afStack_5b0[1] = 0.16666666;
      afStack_5a8[0] = 0.16666666;
      afStack_5a8[1] = 0.16666666;
      auVar50._8_4_ = 0.16666666;
      auVar50._12_4_ = 0.16666666;
      auVar50._0_4_ = 0.16666666;
      auVar50._4_4_ = 0.16666666;
      auVar50._16_4_ = 0.16666666;
      auVar50._20_4_ = 0.16666666;
      auVar50._24_4_ = 0.16666666;
      auVar50._28_4_ = 0.16666666;
      auVar24 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar24),auVar50);
      local_910 = ::_ps256_cephes_exp_p5;
      local_1b20 = auVar24._0_8_;
      local_520 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uStack_518 = uStack_1b18;
      uStack_510 = 0;
      uStack_508 = 0;
      local_540 = local_1a60._0_8_;
      uStack_538 = local_1a60._8_8_;
      uStack_530 = 0;
      uStack_528 = 0;
      local_560[0] = 0.5;
      local_560[1] = 0.5;
      afStack_558[0] = 0.5;
      afStack_558[1] = 0.5;
      afStack_550[0] = 0.5;
      afStack_550[1] = 0.5;
      afStack_548[0] = 0.5;
      afStack_548[1] = 0.5;
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar24 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar24),auVar51);
      local_920 = local_1a80;
      local_1b20 = auVar24._0_8_;
      local_4c0 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uStack_4b8 = uStack_1b18;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      uStack_1a78 = auVar18._8_8_;
      uStack_4d8 = uStack_1a78;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      local_500 = local_1a60._0_8_;
      uStack_4f8 = local_1a60._8_8_;
      uStack_4f0 = 0;
      uStack_4e8 = 0;
      auVar24 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar24),auVar80);
      local_1b20 = auVar24._0_8_;
      uVar23 = local_1b20;
      uStack_1b18 = auVar24._8_8_;
      uVar25 = uStack_1b18;
      uStack_17f0 = 0;
      uStack_17e8 = 0;
      local_1820 = 0x3f8000003f800000;
      uStack_1818 = 0x3f8000003f800000;
      uStack_1810 = 0x3f8000003f800000;
      uStack_1808 = 0x3f8000003f800000;
      local_1800._0_4_ = auVar24._0_4_;
      local_1800._4_4_ = auVar24._4_4_;
      uStack_17f8._0_4_ = auVar24._8_4_;
      uStack_17f8._4_4_ = auVar24._12_4_;
      local_1b20._4_4_ = local_1800._4_4_ + 1.0;
      local_1b20._0_4_ = (float)local_1800 + 1.0;
      uStack_1b18._0_4_ = (float)uStack_17f8 + 1.0;
      uStack_1b18._4_4_ = uStack_17f8._4_4_ + 1.0;
      uStack_1b10._0_4_ = 0x3f800000;
      uStack_1b10._4_4_ = 0x3f800000;
      auVar68 = _local_1b20;
      uStack_1b08._0_4_ = 0x3f800000;
      uStack_1b08._4_4_ = 0x3f800000;
      auVar20 = _local_1b20;
      local_800._0_4_ = local_1aa0._0_4_;
      local_800._4_4_ = local_1aa0._4_4_;
      uStack_7f8._0_4_ = local_1aa0._8_4_;
      uStack_7f8._4_4_ = local_1aa0._12_4_;
      uStack_7f0._0_4_ = local_1aa0._16_4_;
      uStack_7f0._4_4_ = local_1aa0._20_4_;
      uStack_7e8._0_4_ = local_1aa0._24_4_;
      uStack_7e8._4_4_ = local_1aa0._28_4_;
      local_1ac0._4_4_ = (int)local_800._4_4_;
      local_1ac0._0_4_ = (int)(float)local_800;
      local_1ac0._8_4_ = (int)(float)uStack_7f8;
      local_1ac0._12_4_ = (int)uStack_7f8._4_4_;
      local_1ac0._16_4_ = (int)(float)uStack_7f0;
      local_1ac0._20_4_ = (int)uStack_7f0._4_4_;
      auVar72 = local_1ac0._0_24_;
      local_1ac0._24_4_ = (int)(float)uStack_7e8;
      local_1ac0._28_4_ = (int)uStack_7e8._4_4_;
      auVar21 = local_1ac0;
      local_7c0 = local_1ac0._0_8_;
      uStack_7b8 = local_1ac0._8_8_;
      local_1ac0._16_8_ = auVar72._16_8_;
      uStack_7b0 = local_1ac0._16_8_;
      local_1ac0._24_8_ = auVar21._24_8_;
      uStack_7a8 = local_1ac0._24_8_;
      local_7e0 = 0x7f0000007f;
      uStack_7d8 = 0x7f0000007f;
      uStack_7d0 = 0x7f0000007f;
      uStack_7c8 = 0x7f0000007f;
      local_3c0 = local_1ac0._0_8_;
      uStack_3b8 = local_1ac0._8_8_;
      uStack_3b0 = local_1ac0._16_8_;
      uStack_3a8 = local_1ac0._24_8_;
      local_3e0 = 0x7f0000007f;
      uStack_3d8 = 0x7f0000007f;
      uStack_3d0 = 0x7f0000007f;
      uStack_3c8 = 0x7f0000007f;
      auVar55._16_8_ = local_1ac0._16_8_;
      auVar55._0_16_ = local_1ac0._0_16_;
      auVar55._24_8_ = local_1ac0._24_8_;
      auVar54._8_8_ = 0x7f0000007f;
      auVar54._0_8_ = 0x7f0000007f;
      auVar54._16_8_ = 0x7f0000007f;
      auVar54._24_8_ = 0x7f0000007f;
      auVar21 = vpaddd_avx2(auVar55,auVar54);
      local_1ac0._0_8_ = auVar21._0_8_;
      local_780 = local_1ac0._0_8_;
      local_1ac0._8_8_ = auVar21._8_8_;
      uStack_778 = local_1ac0._8_8_;
      local_1ac0._16_8_ = auVar21._16_8_;
      uStack_770 = local_1ac0._16_8_;
      local_1ac0._24_8_ = auVar21._24_8_;
      uStack_768 = local_1ac0._24_8_;
      local_784 = 0x17;
      local_380 = local_1ac0._0_8_;
      uStack_378 = local_1ac0._8_8_;
      uStack_370 = local_1ac0._16_8_;
      uStack_368 = local_1ac0._24_8_;
      local_384 = 0x17;
      local_1ac0 = vpslld_avx2(auVar21,ZEXT416(0x17));
      local_760 = local_1ac0._0_8_;
      uStack_758 = local_1ac0._8_8_;
      uStack_750 = local_1ac0._16_8_;
      uStack_748 = local_1ac0._24_8_;
      local_1b40 = local_1ac0._0_8_;
      uStack_1b38 = local_1ac0._8_8_;
      uStack_1b30 = local_1ac0._16_8_;
      uStack_1b28 = local_1ac0._24_8_;
      local_1900 = local_1b20;
      uStack_18f8 = uStack_1b18;
      uStack_1b10 = auVar68._16_8_;
      uStack_18f0 = uStack_1b10;
      uStack_1b08 = auVar20._24_8_;
      uStack_18e8 = uStack_1b08;
      local_1920._0_4_ = local_1ac0._0_4_;
      local_1920._4_4_ = local_1ac0._4_4_;
      uStack_1918._0_4_ = local_1ac0._8_4_;
      uStack_1918._4_4_ = local_1ac0._12_4_;
      uStack_1910._0_4_ = local_1ac0._16_4_;
      uStack_1910._4_4_ = local_1ac0._20_4_;
      uStack_1908._0_4_ = local_1ac0._24_4_;
      local_1b20._4_4_ = (local_1800._4_4_ + 1.0) * local_1920._4_4_;
      local_1b20._0_4_ = ((float)local_1800 + 1.0) * (float)local_1920;
      uStack_1b18._0_4_ = ((float)uStack_17f8 + 1.0) * (float)uStack_1918;
      uStack_1b18._4_4_ = (uStack_17f8._4_4_ + 1.0) * uStack_1918._4_4_;
      uStack_1b10._0_4_ = (float)uStack_1910 * 1.0;
      uStack_1b10._4_4_ = uStack_1910._4_4_ * 1.0;
      auVar68 = _local_1b20;
      uStack_1b08._0_4_ = (float)uStack_1908 * 1.0;
      uStack_1b08._4_4_ = 0x3f800000;
      auVar20 = _local_1b20;
      uStack_1b10 = auVar68._16_8_;
      uStack_1b08 = auVar20._24_8_;
      local_1940 = local_1b20;
      uStack_1938 = uStack_1b18;
      uStack_1930 = uStack_1b10;
      uStack_1928 = uStack_1b08;
      local_1960 = local_a00._0_8_;
      uStack_1958 = local_a00._8_8_;
      uStack_1950 = auStack_9f0._0_8_;
      uStack_1948 = auStack_9f0._8_8_;
      auVar30._16_8_ = uStack_1b10;
      auVar30._0_16_ = _local_1b20;
      auVar30._24_8_ = uStack_1b08;
      auVar21._16_8_ = auStack_9f0._0_8_;
      auVar21._0_16_ = local_a00;
      auVar21._24_8_ = auStack_9f0._8_8_;
      auVar21 = vsubps_avx(auVar30,auVar21);
      local_2a00 = auVar21._0_8_;
      uVar26 = local_2a00;
      uStack_29f8 = auVar21._8_8_;
      uVar27 = uStack_29f8;
      uStack_29f0 = auVar21._16_8_;
      uVar28 = uStack_29f0;
      uStack_29e8 = auVar21._24_8_;
      uVar29 = uStack_29e8;
      local_1840._0_4_ = local_9c0._0_4_;
      local_1840._4_4_ = local_9c0._4_4_;
      uStack_1838._0_4_ = local_9c0._8_4_;
      uStack_1838._4_4_ = local_9c0._12_4_;
      uStack_1830._0_4_ = auStack_9b0._0_4_;
      uStack_1830._4_4_ = auStack_9b0._4_4_;
      uStack_1828._0_4_ = auStack_9b0._8_4_;
      uStack_1828._4_4_ = auStack_9b0._12_4_;
      local_1860._0_4_ = auVar21._0_4_;
      local_1860._4_4_ = auVar21._4_4_;
      uStack_1858._0_4_ = auVar21._8_4_;
      uStack_1858._4_4_ = auVar21._12_4_;
      uStack_1850._0_4_ = auVar21._16_4_;
      uStack_1850._4_4_ = auVar21._20_4_;
      uStack_1848._0_4_ = auVar21._24_4_;
      local_2a00 = CONCAT44(local_1840._4_4_ * local_1860._4_4_,
                            (float)local_1840 * (float)local_1860);
      uStack_29f8._0_4_ = (float)uStack_1838 * (float)uStack_1858;
      uStack_29f8._4_4_ = uStack_1838._4_4_ * uStack_1858._4_4_;
      uStack_29f0._0_4_ = (float)uStack_1830 * (float)uStack_1850;
      uStack_29f0._4_4_ = uStack_1830._4_4_ * uStack_1850._4_4_;
      auVar68 = _local_2a00;
      uStack_29e8._0_4_ = (float)uStack_1828 * (float)uStack_1848;
      uStack_29e8._4_4_ = uStack_1828._4_4_;
      auVar21 = _local_2a00;
      local_29c0 = auVar19._0_8_;
      uStack_29b8 = auVar19._8_8_;
      uStack_29b0 = auVar19._16_8_;
      uStack_29a8 = auVar19._24_8_;
      local_17e0 = local_2a00;
      uStack_17d8 = uStack_29f8;
      uStack_29f0 = auVar68._16_8_;
      uStack_17d0 = uStack_29f0;
      uStack_29e8 = auVar21._24_8_;
      uStack_17c8 = uStack_29e8;
      local_17c0._0_4_ = auVar19._0_4_;
      local_17c0._4_4_ = auVar19._4_4_;
      uStack_17b8._0_4_ = auVar19._8_4_;
      uStack_17b8._4_4_ = auVar19._12_4_;
      uStack_17b0._0_4_ = auVar19._16_4_;
      uStack_17b0._4_4_ = auVar19._20_4_;
      uStack_17a8._0_4_ = auVar19._24_4_;
      uStack_17a8._4_4_ = auVar19._28_4_;
      local_18a0 = (float)local_17c0 + (float)local_1840 * (float)local_1860;
      fStack_189c = local_17c0._4_4_ + local_1840._4_4_ * local_1860._4_4_;
      fStack_1898 = (float)uStack_17b8 + (float)uStack_1838 * (float)uStack_1858;
      fStack_1894 = uStack_17b8._4_4_ + uStack_1838._4_4_ * uStack_1858._4_4_;
      fStack_1890 = (float)uStack_17b0 + (float)uStack_1830 * (float)uStack_1850;
      fStack_188c = uStack_17b0._4_4_ + uStack_1830._4_4_ * uStack_1850._4_4_;
      fStack_1888 = (float)uStack_17a8 + (float)uStack_1828 * (float)uStack_1848;
      fStack_1884 = uStack_17a8._4_4_ + uStack_1828._4_4_;
      local_1880._0_4_ = auVar17._0_4_;
      local_1880._4_4_ = auVar17._4_4_;
      uStack_1878._0_4_ = auVar17._8_4_;
      uStack_1878._4_4_ = auVar17._12_4_;
      uStack_1870._0_4_ = auVar16._0_4_;
      uStack_1870._4_4_ = auVar16._4_4_;
      uStack_1868._0_4_ = auVar16._8_4_;
      uStack_1868._4_4_ = auVar16._12_4_;
      local_2a00 = CONCAT44(local_1880._4_4_ * fStack_189c,(float)local_1880 * local_18a0);
      uStack_29f8._0_4_ = (float)uStack_1878 * fStack_1898;
      uStack_29f8._4_4_ = uStack_1878._4_4_ * fStack_1894;
      uStack_29f0._0_4_ = (float)uStack_1870 * fStack_1890;
      uStack_29f0._4_4_ = uStack_1870._4_4_ * fStack_188c;
      auVar68 = _local_2a00;
      uStack_29e8._0_4_ = (float)uStack_1868 * fStack_1888;
      uStack_29e8._4_4_ = uStack_1868._4_4_;
      auVar21 = _local_2a00;
      local_1778 = local_2678;
      local_17a0 = local_2a00;
      uStack_1798 = uStack_29f8;
      uStack_29f0 = auVar68._16_8_;
      uStack_1790 = uStack_29f0;
      uStack_29e8 = auVar21._24_8_;
      uStack_1788 = uStack_29e8;
      *(undefined8 *)*local_2678 = local_2a00;
      *(undefined8 *)(*local_2678 + 8) = uStack_29f8;
      *(undefined8 *)(*local_2678 + 0x10) = uStack_29f0;
      *(undefined8 *)(*local_2678 + 0x18) = uStack_29e8;
      local_2678 = (undefined1 (*) [64])(*local_2678 + 0x20);
      local_1b80 = local_1bc0;
      uStack_1b78 = uStack_1bb8;
      uStack_1b70 = uStack_1bb0;
      uStack_1b68 = uStack_1ba8;
      _local_1b20 = auVar20;
      _local_1a80 = auVar22;
      local_1a60 = auVar80;
      local_1920 = local_1ac0._0_8_;
      uStack_1918 = local_1ac0._8_8_;
      uStack_1910 = local_1ac0._16_8_;
      uStack_1908 = local_1ac0._24_8_;
      local_18c0 = local_18e0;
      uStack_18b8 = uStack_18d8;
      uStack_18b0 = uStack_18d0;
      uStack_18a8 = uStack_18c8;
      local_1880 = local_980._0_8_;
      uStack_1878 = local_980._8_8_;
      uStack_1870 = local_980._16_8_;
      uStack_1868 = local_980._24_8_;
      local_1860 = uVar26;
      uStack_1858 = uVar27;
      uStack_1850 = uVar28;
      uStack_1848 = uVar29;
      local_1840 = local_9c0._0_8_;
      uStack_1838 = local_9c0._8_8_;
      uStack_1830 = auStack_9b0._0_8_;
      uStack_1828 = auStack_9b0._8_8_;
      local_1800 = uVar23;
      uStack_17f8 = uVar25;
      local_17c0 = local_29c0;
      uStack_17b8 = uStack_29b8;
      uStack_17b0 = uStack_29b0;
      uStack_17a8 = uStack_29a8;
      local_908 = local_928;
      local_900 = local_918;
      local_8f0 = local_928;
      local_8e8 = local_918;
      local_8d8 = local_928;
      local_8d0 = local_918;
      local_8c0 = local_928;
      local_8b8 = local_918;
      local_8a8 = local_928;
      local_8a0 = local_918;
      local_888 = local_928;
      local_830 = local_928;
      local_818 = local_928;
      local_808 = local_820;
      local_800 = local_1aa0._0_8_;
      uStack_7f8 = local_1aa0._8_8_;
      uStack_7f0 = local_1aa0._16_8_;
      uStack_7e8 = local_1aa0._24_8_;
    }
    local_1770 = (undefined1  [16])0x0;
    local_170c = 0x3f800000;
    local_1720 = 0x3f800000;
    uStack_171c = 0x3f800000;
    uStack_1718 = 0x3f800000;
    uStack_1714 = 0x3f800000;
    local_1740 = *(float *)(in_RDI + 0xd0);
    local_1760 = *(float *)(in_RDI + 0xd4);
    for (; local_26d0 + 3 < local_2668; local_26d0 = local_26d0 + 4) {
      local_1708 = local_2678;
      local_1700 = *(undefined8 *)*local_2678;
      uStack_16f8 = *(undefined8 *)(*local_2678 + 8);
      local_16f0 = 0;
      uStack_16e8 = 0;
      auVar24 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2678);
      local_16d0 = 0;
      uStack_16c8 = 0;
      auVar16 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2678);
      local_2a70 = auVar16._0_8_;
      uStack_2a68 = auVar16._8_8_;
      local_1640 = (undefined1  [16])0x0;
      local_1690 = 0x3f800000;
      uStack_168c = 0x3f800000;
      uStack_1688 = 0x3f800000;
      uStack_1684 = 0x3f800000;
      local_1600 = local_2a70;
      uStack_15f8 = uStack_2a68;
      local_1610 = 0x42b0c0a5;
      uStack_160c = 0x42b0c0a5;
      uStack_1608 = 0x42b0c0a5;
      uStack_1604 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar18);
      local_1650._0_8_ = auVar16._0_8_;
      local_1620 = local_1650._0_8_;
      local_1650._8_8_ = auVar16._8_8_;
      uStack_1618 = local_1650._8_8_;
      local_1630 = 0xc2b0c0a5;
      uStack_162c = 0xc2b0c0a5;
      uStack_1628 = 0xc2b0c0a5;
      uStack_1624 = 0xc2b0c0a5;
      auVar17._8_4_ = 0xc2b0c0a5;
      auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar16,auVar17);
      local_1650._0_8_ = auVar18._0_8_;
      uVar23 = local_1650._0_8_;
      local_1650._8_8_ = auVar18._8_8_;
      uVar25 = local_1650._8_8_;
      local_1570 = 0x3fb8aa3b;
      uStack_156c = 0x3fb8aa3b;
      uStack_1568 = 0x3fb8aa3b;
      uStack_1564 = 0x3fb8aa3b;
      local_1560._0_4_ = auVar18._0_4_;
      local_1560._4_4_ = auVar18._4_4_;
      uStack_1558._0_4_ = auVar18._8_4_;
      uStack_1558._4_4_ = auVar18._12_4_;
      local_1670._4_4_ = local_1560._4_4_ * 1.442695;
      local_1670._0_4_ = (float)local_1560 * 1.442695;
      uStack_1668._0_4_ = (float)uStack_1558 * 1.442695;
      uStack_1668._4_4_ = uStack_1558._4_4_ * 1.442695;
      local_14e0 = local_1670;
      uStack_14d8 = uStack_1668;
      local_14f0 = 0x3f000000;
      uStack_14ec = 0x3f000000;
      uStack_14e8 = 0x3f000000;
      uStack_14e4 = 0x3f000000;
      local_1670._0_4_ = (float)local_1560 * 1.442695 + 0.5;
      local_1670._4_4_ = local_1560._4_4_ * 1.442695 + 0.5;
      fVar81 = (float)uStack_1558 * 1.442695 + 0.5;
      fVar82 = uStack_1558._4_4_ * 1.442695 + 0.5;
      uStack_1668._0_4_ = fVar81;
      uStack_1668._4_4_ = fVar82;
      local_340 = local_1670;
      uStack_338 = uStack_1668;
      local_1680._4_4_ = (int)(float)local_1670._4_4_;
      local_1680._0_4_ = (int)(float)local_1670._0_4_;
      local_1680._8_4_ = (int)fVar81;
      local_1680._12_4_ = (int)fVar82;
      local_330 = local_1680._0_8_;
      uStack_328 = local_1680._8_8_;
      auVar56._8_8_ = local_1680._8_8_;
      auVar56._0_8_ = local_1680._0_8_;
      auVar17 = vcvtdq2ps_avx(auVar56);
      local_1660 = auVar17._0_8_;
      local_310 = local_1660;
      uStack_1658 = auVar17._8_8_;
      uStack_308 = uStack_1658;
      local_320 = local_1670;
      uStack_318 = uStack_1668;
      auVar57._8_8_ = uStack_1668;
      auVar57._0_8_ = local_1670;
      auVar16 = vcmpps_avx(auVar57,auVar17,1);
      local_16a0._0_8_ = auVar16._0_8_;
      local_2f0 = local_16a0._0_8_;
      local_16a0._8_8_ = auVar16._8_8_;
      uStack_2e8 = local_16a0._8_8_;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      auVar58._8_8_ = 0x3f8000003f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      local_16a0 = vpand_avx(auVar16,auVar58);
      local_15e0 = local_1660;
      uStack_15d8 = uStack_1658;
      local_15f0 = local_16a0._0_8_;
      uStack_15e8 = local_16a0._8_8_;
      _local_1670 = vsubps_avx(auVar17,local_16a0);
      local_2d0 = local_1670;
      local_2c0 = ::_ps_cephes_exp_C1;
      local_2e0 = local_1650;
      local_1b0 = local_1670;
      uStack_1a8 = uStack_1668;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_1650._0_8_;
      uStack_1c8 = local_1650._8_8_;
      auVar61._8_4_ = 0.6933594;
      auVar61._12_4_ = 0.6933594;
      auVar61._0_4_ = 0.6933594;
      auVar61._4_4_ = 0.6933594;
      auVar16 = vfnmadd213ps_fma(auVar61,_local_1670,auVar18);
      local_2d8 = ::_ps_cephes_exp_C2;
      local_180 = local_1670;
      uStack_178 = uStack_1668;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_1650._0_8_ = auVar16._0_8_;
      local_1a0 = local_1650._0_8_;
      local_1650._8_8_ = auVar16._8_8_;
      uStack_198 = local_1650._8_8_;
      auVar62._8_4_ = -0.00021219444;
      auVar62._12_4_ = -0.00021219444;
      auVar62._0_4_ = -0.00021219444;
      auVar62._4_4_ = -0.00021219444;
      local_1650 = vfnmadd213ps_fma(auVar62,_local_1670,auVar16);
      local_1590 = local_1650._0_8_;
      uStack_1588 = local_1650._8_8_;
      local_1580._0_4_ = local_1650._0_4_;
      local_1580._4_4_ = local_1650._4_4_;
      uStack_1578._0_4_ = local_1650._8_4_;
      uStack_1578._4_4_ = local_1650._12_4_;
      local_1660._4_4_ = local_1580._4_4_ * local_1580._4_4_;
      local_1660._0_4_ = (float)local_1580 * (float)local_1580;
      uStack_1658._0_4_ = (float)uStack_1578 * (float)uStack_1578;
      uStack_1658._4_4_ = uStack_1578._4_4_ * uStack_1578._4_4_;
      uStack_16a8._0_4_ = 0x39506967;
      local_16b0 = (undefined1  [8])0x3950696739506967;
      uStack_16a8._4_4_ = 0x39506967;
      local_2a0 = local_16b0;
      local_238 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_16a8;
      local_160 = local_1650._0_8_;
      uStack_158 = local_1650._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar63._8_4_ = 0.0013981999;
      auVar63._12_4_ = 0.0013981999;
      auVar63._0_4_ = 0.0013981999;
      auVar63._4_4_ = 0.0013981999;
      auVar16 = vfmadd213ps_fma(local_1650,_local_16b0,auVar63);
      local_250 = ::_ps_cephes_exp_p2;
      local_16b0 = auVar16._0_8_;
      local_120 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uStack_118 = uStack_16a8;
      local_130 = local_1650._0_8_;
      uStack_128 = local_1650._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar64._8_4_ = 0.008333452;
      auVar64._12_4_ = 0.008333452;
      auVar64._0_4_ = 0.008333452;
      auVar64._4_4_ = 0.008333452;
      auVar16 = vfmadd213ps_fma(local_1650,auVar16,auVar64);
      local_268 = ::_ps_cephes_exp_p3;
      local_16b0 = auVar16._0_8_;
      local_f0 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uStack_e8 = uStack_16a8;
      local_100 = local_1650._0_8_;
      uStack_f8 = local_1650._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar65._8_4_ = 0.041665796;
      auVar65._12_4_ = 0.041665796;
      auVar65._0_4_ = 0.041665796;
      auVar65._4_4_ = 0.041665796;
      auVar16 = vfmadd213ps_fma(local_1650,auVar16,auVar65);
      local_280 = ::_ps_cephes_exp_p4;
      local_16b0 = auVar16._0_8_;
      local_c0 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uStack_b8 = uStack_16a8;
      local_d0 = local_1650._0_8_;
      uStack_c8 = local_1650._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar66._8_4_ = 0.16666666;
      auVar66._12_4_ = 0.16666666;
      auVar66._0_4_ = 0.16666666;
      auVar66._4_4_ = 0.16666666;
      auVar16 = vfmadd213ps_fma(local_1650,auVar16,auVar66);
      local_298 = ::_ps_cephes_exp_p5;
      local_16b0 = auVar16._0_8_;
      local_90 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uStack_88 = uStack_16a8;
      local_a0 = local_1650._0_8_;
      uStack_98 = local_1650._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar67._8_4_ = 0.5;
      auVar67._12_4_ = 0.5;
      auVar67._0_4_ = 0.5;
      auVar67._4_4_ = 0.5;
      auVar16 = vfmadd213ps_fma(local_1650,auVar16,auVar67);
      local_2a8 = local_1660;
      local_16b0 = auVar16._0_8_;
      local_60 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uStack_58 = uStack_16a8;
      local_70 = local_1660;
      uStack_68 = uStack_1658;
      local_80 = local_1650._0_8_;
      uStack_78 = local_1650._8_8_;
      auVar16 = vfmadd213ps_fma(_local_1660,auVar16,local_1650);
      local_16b0 = auVar16._0_8_;
      uVar26 = local_16b0;
      uStack_16a8 = auVar16._8_8_;
      uVar27 = uStack_16a8;
      local_1510 = 0x3f8000003f800000;
      uStack_1508 = 0x3f8000003f800000;
      local_1500._0_4_ = auVar16._0_4_;
      local_1500._4_4_ = auVar16._4_4_;
      uStack_14f8._0_4_ = auVar16._8_4_;
      uStack_14f8._4_4_ = auVar16._12_4_;
      local_16b0._4_4_ = local_1500._4_4_ + 1.0;
      local_16b0._0_4_ = (float)local_1500 + 1.0;
      uStack_16a8._0_4_ = (float)uStack_14f8 + 1.0;
      uStack_16a8._4_4_ = uStack_14f8._4_4_ + 1.0;
      local_350._0_4_ = local_1670._0_4_;
      local_350._4_4_ = local_1670._4_4_;
      uStack_348._0_4_ = local_1670._8_4_;
      uStack_348._4_4_ = local_1670._12_4_;
      local_1680._4_4_ = (int)local_350._4_4_;
      local_1680._0_4_ = (int)(float)local_350;
      local_1680._8_4_ = (int)(float)uStack_348;
      local_1680._12_4_ = (int)uStack_348._4_4_;
      local_210 = local_1680._0_8_;
      uStack_208 = local_1680._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar60._8_8_ = local_1680._8_8_;
      auVar60._0_8_ = local_1680._0_8_;
      auVar59._8_8_ = 0x7f0000007f;
      auVar59._0_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx(auVar60,auVar59);
      local_1680._0_8_ = auVar16._0_8_;
      local_1f0 = local_1680._0_8_;
      local_1680._8_8_ = auVar16._8_8_;
      uStack_1e8 = local_1680._8_8_;
      local_1f4 = 0x17;
      local_1680 = vpslld_avx(auVar16,ZEXT416(0x17));
      local_1e0 = local_1680._0_8_;
      uStack_1d8 = local_1680._8_8_;
      local_16c0 = local_1680._0_8_;
      uStack_16b8 = local_1680._8_8_;
      local_15a0 = local_16b0;
      uStack_1598 = uStack_16a8;
      local_15b0._0_4_ = local_1680._0_4_;
      local_15b0._4_4_ = local_1680._4_4_;
      uStack_15a8._0_4_ = local_1680._8_4_;
      uStack_15a8._4_4_ = local_1680._12_4_;
      local_16b0._4_4_ = (local_1500._4_4_ + 1.0) * local_15b0._4_4_;
      local_16b0._0_4_ = ((float)local_1500 + 1.0) * (float)local_15b0;
      uStack_16a8._0_4_ = ((float)uStack_14f8 + 1.0) * (float)uStack_15a8;
      uStack_16a8._4_4_ = (uStack_14f8._4_4_ + 1.0) * uStack_15a8._4_4_;
      local_15c0 = local_16b0;
      uStack_15b8 = uStack_16a8;
      auVar31._8_8_ = uStack_16a8;
      auVar31._0_8_ = local_16b0;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16 = vsubps_avx(auVar31,auVar16);
      local_2a80 = auVar16._0_8_;
      uVar28 = local_2a80;
      uStack_2a78 = auVar16._8_8_;
      uVar29 = uStack_2a78;
      local_1530._0_4_ = auVar16._0_4_;
      local_1530._4_4_ = auVar16._4_4_;
      uStack_1528._0_4_ = auVar16._8_4_;
      uStack_1528._4_4_ = auVar16._12_4_;
      local_2a80 = CONCAT44(local_1740 * local_1530._4_4_,local_1740 * (float)local_1530);
      uStack_2a78._0_4_ = local_1740 * (float)uStack_1528;
      uStack_2a78._4_4_ = local_1740 * uStack_1528._4_4_;
      local_2a60 = auVar24._0_8_;
      uStack_2a58 = auVar24._8_8_;
      local_14d0 = local_2a80;
      uStack_14c8 = uStack_2a78;
      local_14c0._0_4_ = auVar24._0_4_;
      local_14c0._4_4_ = auVar24._4_4_;
      uStack_14b8._0_4_ = auVar24._8_4_;
      uStack_14b8._4_4_ = auVar24._12_4_;
      local_1550 = (float)local_14c0 + local_1740 * (float)local_1530;
      fStack_154c = local_14c0._4_4_ + local_1740 * local_1530._4_4_;
      fStack_1548 = (float)uStack_14b8 + local_1740 * (float)uStack_1528;
      fStack_1544 = uStack_14b8._4_4_ + local_1740 * uStack_1528._4_4_;
      local_2a80 = CONCAT44(local_1760 * fStack_154c,local_1760 * local_1550);
      uStack_2a78._0_4_ = local_1760 * fStack_1548;
      uStack_2a78._4_4_ = local_1760 * fStack_1544;
      local_1498 = local_2678;
      local_14b0 = local_2a80;
      uStack_14a8 = uStack_2a78;
      *(undefined8 *)*local_2678 = local_2a80;
      *(undefined8 *)(*local_2678 + 8) = uStack_2a78;
      local_2678 = (undefined1 (*) [64])(*local_2678 + 0x10);
      local_16e0 = local_1700;
      uStack_16d8 = uStack_16f8;
      local_15d0 = 0x3f8000003f800000;
      uStack_15c8 = 0x3f8000003f800000;
      local_15b0 = local_1680._0_8_;
      uStack_15a8 = local_1680._8_8_;
      local_1580 = local_1590;
      uStack_1578 = uStack_1588;
      local_1560 = uVar23;
      uStack_1558 = uVar25;
      local_1540 = CONCAT44(local_1760,local_1760);
      uStack_1538 = CONCAT44(local_1760,local_1760);
      local_1530 = uVar28;
      uStack_1528 = uVar29;
      local_1520 = CONCAT44(local_1740,local_1740);
      uStack_1518 = CONCAT44(local_1740,local_1740);
      local_1500 = uVar26;
      uStack_14f8 = uVar27;
      local_14c0 = local_2a60;
      uStack_14b8 = uStack_2a58;
      local_350 = local_1670;
      uStack_348 = uStack_1668;
      local_2c8 = local_2e0;
      local_2b8 = local_2d0;
      local_2b0 = local_2e0;
      local_290 = local_2e0;
      local_288 = local_2a0;
      local_278 = local_2e0;
      local_270 = local_2a0;
      local_260 = local_2e0;
      local_258 = local_2a0;
      local_248 = local_2e0;
      local_240 = local_2a0;
      local_230 = local_2e0;
      local_228 = local_2a0;
    }
    fVar81 = *(float *)(in_RDI + 0xd0);
    fVar82 = *(float *)(in_RDI + 0xd4);
    fStack_175c = local_1760;
    fStack_1758 = local_1760;
    fStack_1754 = local_1760;
    local_1744 = local_1760;
    fStack_173c = local_1740;
    fStack_1738 = local_1740;
    fStack_1734 = local_1740;
    local_1724 = local_1740;
    local_1430 = local_2610;
    local_9a0 = local_1bd0;
    local_99c = local_1bd0;
    local_998 = local_1bd0;
    local_994 = local_1bd0;
    local_990 = local_1bd0;
    local_98c = local_1bd0;
    local_988 = local_1bd0;
    local_984 = local_1bd0;
    local_980 = auVar79;
    local_948 = local_1bd4;
    local_944 = local_1bd4;
    local_940 = local_1bd4;
    local_93c = local_1bd4;
    local_938 = local_1bd4;
    local_934 = local_1bd4;
    local_930 = local_1bd4;
    local_92c = local_1bd4;
    local_26a0 = local_1490;
    for (; local_26d0 < local_2668; local_26d0 = local_26d0 + 1) {
      if (0.0 <= *(float *)*local_2678) {
        *(float *)*local_2678 = *(float *)*local_2678 * *(float *)(in_RDI + 0xd4);
      }
      else {
        fVar78 = expf(*(float *)*local_2678);
        *(float *)*local_2678 = (fVar78 - 1.0) * fVar81 * fVar82;
      }
      local_2678 = (undefined1 (*) [64])(*local_2678 + 4);
    }
  }
  return 0;
}

Assistant:

int SELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}